

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  Primitive PVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined6 uVar42;
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  int iVar64;
  undefined4 uVar65;
  ulong uVar66;
  undefined4 uVar69;
  undefined1 (*pauVar67) [16];
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *pRVar68;
  RTCIntersectArguments *pRVar70;
  RTCIntersectArguments *pRVar71;
  int iVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  long lVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  short sVar81;
  undefined2 uVar123;
  float fVar82;
  uint uVar83;
  float fVar124;
  float fVar126;
  __m128 a_2;
  uint uVar125;
  uint uVar127;
  uint uVar128;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float s;
  float fVar129;
  float fVar152;
  float fVar153;
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar164;
  float fVar165;
  vfloat4 v;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar183;
  float fVar184;
  vfloat4 v_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar198;
  float fVar199;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar230;
  float fVar231;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar256;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar266;
  float fVar267;
  __m128 a_1;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar268;
  float fVar280;
  float fVar281;
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar282;
  float fVar288;
  float fVar289;
  vfloat4 a;
  undefined1 auVar283 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar290;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar300;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float s_2;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  RTCFilterFunctionNArguments local_578;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [16];
  undefined4 local_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 local_4d8;
  float fStack_4d0;
  float fStack_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  undefined4 uStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  Primitive *local_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 uVar122;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  
  PVar20 = prim[1];
  uVar66 = (ulong)(byte)PVar20;
  lVar76 = uVar66 * 0x25;
  pPVar9 = prim + lVar76 + 6;
  fVar165 = *(float *)(pPVar9 + 0xc);
  fVar166 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar165;
  fVar183 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar165;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar165;
  fVar154 = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar164 = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar165 = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar65 = *(undefined4 *)(prim + uVar66 * 4 + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar273._8_4_ = 0;
  auVar273._0_8_ = uVar73;
  auVar273._12_2_ = uVar123;
  auVar273._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar156._12_4_ = auVar273._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar73;
  auVar156._10_2_ = uVar123;
  auVar84._10_6_ = auVar156._10_6_;
  auVar84._8_2_ = uVar123;
  auVar84._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar43._4_8_ = auVar84._8_8_;
  auVar43._2_2_ = uVar123;
  auVar43._0_2_ = uVar123;
  fVar311 = (float)((int)sVar81 >> 8);
  fVar313 = (float)(auVar43._0_4_ >> 0x18);
  fVar314 = (float)(auVar84._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 5 + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar73;
  auVar132._12_2_ = uVar123;
  auVar132._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._8_2_ = 0;
  auVar131._0_8_ = uVar73;
  auVar131._10_2_ = uVar123;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = uVar123;
  auVar130._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar44._4_8_ = auVar130._8_8_;
  auVar44._2_2_ = uVar123;
  auVar44._0_2_ = uVar123;
  fVar185 = (float)((int)sVar81 >> 8);
  fVar198 = (float)(auVar44._0_4_ >> 0x18);
  fVar199 = (float)(auVar130._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 6 + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar135._8_4_ = 0;
  auVar135._0_8_ = uVar73;
  auVar135._12_2_ = uVar123;
  auVar135._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar73;
  auVar134._10_2_ = uVar123;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = uVar123;
  auVar133._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar45._4_8_ = auVar133._8_8_;
  auVar45._2_2_ = uVar123;
  auVar45._0_2_ = uVar123;
  fVar232 = (float)((int)sVar81 >> 8);
  fVar241 = (float)(auVar45._0_4_ >> 0x18);
  fVar242 = (float)(auVar133._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 0xf + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar73;
  auVar138._12_2_ = uVar123;
  auVar138._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar73;
  auVar137._10_2_ = uVar123;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = uVar123;
  auVar136._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar46._4_8_ = auVar136._8_8_;
  auVar46._2_2_ = uVar123;
  auVar46._0_2_ = uVar123;
  fVar82 = (float)((int)sVar81 >> 8);
  fVar124 = (float)(auVar46._0_4_ >> 0x18);
  fVar126 = (float)(auVar136._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar73;
  auVar203._12_2_ = uVar123;
  auVar203._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar73;
  auVar202._10_2_ = uVar123;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar123;
  auVar201._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar47._4_8_ = auVar201._8_8_;
  auVar47._2_2_ = uVar123;
  auVar47._0_2_ = uVar123;
  fVar243 = (float)((int)sVar81 >> 8);
  fVar256 = (float)(auVar47._0_4_ >> 0x18);
  fVar257 = (float)(auVar201._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + uVar66 + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar73;
  auVar206._12_2_ = uVar123;
  auVar206._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar73;
  auVar205._10_2_ = uVar123;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar123;
  auVar204._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar48._4_8_ = auVar204._8_8_;
  auVar48._2_2_ = uVar123;
  auVar48._0_2_ = uVar123;
  fVar268 = (float)((int)sVar81 >> 8);
  fVar280 = (float)(auVar48._0_4_ >> 0x18);
  fVar281 = (float)(auVar204._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 0x1a + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar73;
  auVar209._12_2_ = uVar123;
  auVar209._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar73;
  auVar208._10_2_ = uVar123;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar123;
  auVar207._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar49._4_8_ = auVar207._8_8_;
  auVar49._2_2_ = uVar123;
  auVar49._0_2_ = uVar123;
  fVar258 = (float)((int)sVar81 >> 8);
  fVar266 = (float)(auVar49._0_4_ >> 0x18);
  fVar267 = (float)(auVar207._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 0x1b + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar73;
  auVar212._12_2_ = uVar123;
  auVar212._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar73;
  auVar211._10_2_ = uVar123;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar123;
  auVar210._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar50._4_8_ = auVar210._8_8_;
  auVar50._2_2_ = uVar123;
  auVar50._0_2_ = uVar123;
  fVar282 = (float)((int)sVar81 >> 8);
  fVar288 = (float)(auVar50._0_4_ >> 0x18);
  fVar289 = (float)(auVar210._8_4_ >> 0x18);
  uVar65 = *(undefined4 *)(prim + uVar66 * 0x1c + 6);
  uVar122 = (undefined1)((uint)uVar65 >> 0x18);
  uVar123 = CONCAT11(uVar122,uVar122);
  uVar122 = (undefined1)((uint)uVar65 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar123,uVar122),CONCAT14(uVar122,uVar65));
  uVar122 = (undefined1)((uint)uVar65 >> 8);
  uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar122),uVar122);
  sVar81 = CONCAT11((char)uVar65,(char)uVar65);
  uVar73 = CONCAT62(uVar42,sVar81);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar73;
  auVar215._12_2_ = uVar123;
  auVar215._14_2_ = uVar123;
  uVar123 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar73;
  auVar214._10_2_ = uVar123;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar123;
  auVar213._0_8_ = uVar73;
  uVar123 = (undefined2)uVar42;
  auVar51._4_8_ = auVar213._8_8_;
  auVar51._2_2_ = uVar123;
  auVar51._0_2_ = uVar123;
  fVar129 = (float)((int)sVar81 >> 8);
  fVar152 = (float)(auVar51._0_4_ >> 0x18);
  fVar153 = (float)(auVar213._8_4_ >> 0x18);
  fVar300 = fVar154 * fVar311 + fVar164 * fVar185 + fVar165 * fVar232;
  fVar308 = fVar154 * fVar313 + fVar164 * fVar198 + fVar165 * fVar241;
  fVar309 = fVar154 * fVar314 + fVar164 * fVar199 + fVar165 * fVar242;
  fVar310 = fVar154 * (float)(auVar156._12_4_ >> 0x18) +
            fVar164 * (float)(auVar131._12_4_ >> 0x18) + fVar165 * (float)(auVar134._12_4_ >> 0x18);
  fVar290 = fVar154 * fVar82 + fVar164 * fVar243 + fVar165 * fVar268;
  fVar297 = fVar154 * fVar124 + fVar164 * fVar256 + fVar165 * fVar280;
  fVar298 = fVar154 * fVar126 + fVar164 * fVar257 + fVar165 * fVar281;
  fVar299 = fVar154 * (float)(auVar137._12_4_ >> 0x18) +
            fVar164 * (float)(auVar202._12_4_ >> 0x18) + fVar165 * (float)(auVar205._12_4_ >> 0x18);
  fVar200 = fVar154 * fVar258 + fVar164 * fVar282 + fVar165 * fVar129;
  fVar230 = fVar154 * fVar266 + fVar164 * fVar288 + fVar165 * fVar152;
  fVar231 = fVar154 * fVar267 + fVar164 * fVar289 + fVar165 * fVar153;
  fVar165 = fVar154 * (float)(auVar208._12_4_ >> 0x18) +
            fVar164 * (float)(auVar211._12_4_ >> 0x18) + fVar165 * (float)(auVar214._12_4_ >> 0x18);
  fVar312 = fVar311 * fVar166 + fVar185 * fVar183 + fVar232 * fVar184;
  fVar313 = fVar313 * fVar166 + fVar198 * fVar183 + fVar241 * fVar184;
  fVar314 = fVar314 * fVar166 + fVar199 * fVar183 + fVar242 * fVar184;
  fVar315 = (float)(auVar156._12_4_ >> 0x18) * fVar166 +
            (float)(auVar131._12_4_ >> 0x18) * fVar183 + (float)(auVar134._12_4_ >> 0x18) * fVar184;
  fVar268 = fVar82 * fVar166 + fVar243 * fVar183 + fVar268 * fVar184;
  fVar280 = fVar124 * fVar166 + fVar256 * fVar183 + fVar280 * fVar184;
  fVar281 = fVar126 * fVar166 + fVar257 * fVar183 + fVar281 * fVar184;
  fVar311 = (float)(auVar137._12_4_ >> 0x18) * fVar166 +
            (float)(auVar202._12_4_ >> 0x18) * fVar183 + (float)(auVar205._12_4_ >> 0x18) * fVar184;
  fVar258 = fVar166 * fVar258 + fVar183 * fVar282 + fVar184 * fVar129;
  fVar266 = fVar166 * fVar266 + fVar183 * fVar288 + fVar184 * fVar152;
  fVar267 = fVar166 * fVar267 + fVar183 * fVar289 + fVar184 * fVar153;
  fVar282 = fVar166 * (float)(auVar208._12_4_ >> 0x18) +
            fVar183 * (float)(auVar211._12_4_ >> 0x18) + fVar184 * (float)(auVar214._12_4_ >> 0x18);
  uVar83 = (uint)DAT_01f7b6c0;
  uVar125 = DAT_01f7b6c0._4_4_;
  uVar127 = DAT_01f7b6c0._8_4_;
  uVar128 = DAT_01f7b6c0._12_4_;
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar300 & uVar83));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar308 & uVar125));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar309 & uVar127));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar310 & uVar128));
  auVar301._0_4_ = (uint)fVar300 & uVar77;
  auVar301._4_4_ = (uint)fVar308 & uVar78;
  auVar301._8_4_ = (uint)fVar309 & uVar79;
  auVar301._12_4_ = (uint)fVar310 & uVar80;
  auVar167._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x219392ef219392ef;
  auVar167._8_4_ = ~uVar79 & 0x219392ef;
  auVar167._12_4_ = ~uVar80 & 0x219392ef;
  auVar167 = auVar167 | auVar301;
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar290 & uVar83));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar297 & uVar125));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar298 & uVar127));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar299 & uVar128));
  auVar291._0_4_ = (uint)fVar290 & uVar77;
  auVar291._4_4_ = (uint)fVar297 & uVar78;
  auVar291._8_4_ = (uint)fVar298 & uVar79;
  auVar291._12_4_ = (uint)fVar299 & uVar80;
  auVar233._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x219392ef219392ef;
  auVar233._8_4_ = ~uVar79 & 0x219392ef;
  auVar233._12_4_ = ~uVar80 & 0x219392ef;
  auVar233 = auVar233 | auVar291;
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar200 & uVar83));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar230 & uVar125));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar231 & uVar127));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar165 & uVar128));
  auVar216._0_4_ = (uint)fVar200 & uVar77;
  auVar216._4_4_ = (uint)fVar230 & uVar78;
  auVar216._8_4_ = (uint)fVar231 & uVar79;
  auVar216._12_4_ = (uint)fVar165 & uVar80;
  auVar244._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x219392ef219392ef;
  auVar244._8_4_ = ~uVar79 & 0x219392ef;
  auVar244._12_4_ = ~uVar80 & 0x219392ef;
  auVar244 = auVar244 | auVar216;
  auVar84 = rcpps(_DAT_01f7b6c0,auVar167);
  fVar165 = auVar84._0_4_;
  fVar126 = auVar84._4_4_;
  fVar185 = auVar84._8_4_;
  fVar243 = auVar84._12_4_;
  fVar165 = (1.0 - auVar167._0_4_ * fVar165) * fVar165 + fVar165;
  fVar126 = (1.0 - auVar167._4_4_ * fVar126) * fVar126 + fVar126;
  fVar185 = (1.0 - auVar167._8_4_ * fVar185) * fVar185 + fVar185;
  fVar243 = (1.0 - auVar167._12_4_ * fVar243) * fVar243 + fVar243;
  auVar84 = rcpps(auVar84,auVar233);
  fVar82 = auVar84._0_4_;
  fVar129 = auVar84._4_4_;
  fVar198 = auVar84._8_4_;
  fVar256 = auVar84._12_4_;
  fVar82 = (1.0 - auVar233._0_4_ * fVar82) * fVar82 + fVar82;
  fVar129 = (1.0 - auVar233._4_4_ * fVar129) * fVar129 + fVar129;
  fVar198 = (1.0 - auVar233._8_4_ * fVar198) * fVar198 + fVar198;
  fVar256 = (1.0 - auVar233._12_4_ * fVar256) * fVar256 + fVar256;
  auVar84 = rcpps(auVar84,auVar244);
  fVar124 = auVar84._0_4_;
  fVar152 = auVar84._4_4_;
  fVar199 = auVar84._8_4_;
  fVar257 = auVar84._12_4_;
  fVar124 = (1.0 - auVar244._0_4_ * fVar124) * fVar124 + fVar124;
  fVar152 = (1.0 - auVar244._4_4_ * fVar152) * fVar152 + fVar152;
  fVar199 = (1.0 - auVar244._8_4_ * fVar199) * fVar199 + fVar199;
  fVar257 = (1.0 - auVar244._12_4_ * fVar257) * fVar257 + fVar257;
  fVar288 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar76 + 0x16)) *
            *(float *)(prim + lVar76 + 0x1a);
  uVar73 = *(ulong *)(prim + uVar66 * 7 + 6);
  uVar123 = (undefined2)(uVar73 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar73;
  auVar235._12_2_ = uVar123;
  auVar235._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar73 >> 0x20);
  auVar85._12_4_ = auVar235._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar73;
  auVar85._10_2_ = uVar123;
  auVar250._10_6_ = auVar85._10_6_;
  auVar250._8_2_ = uVar123;
  auVar250._0_8_ = uVar73;
  uVar123 = (undefined2)(uVar73 >> 0x10);
  auVar52._4_8_ = auVar250._8_8_;
  auVar52._2_2_ = uVar123;
  auVar52._0_2_ = uVar123;
  fVar153 = (float)(auVar52._0_4_ >> 0x10);
  fVar200 = (float)(auVar250._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar66 * 0xb + 6);
  uVar123 = (undefined2)(uVar10 >> 0x30);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar10;
  auVar170._12_2_ = uVar123;
  auVar170._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar10 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar10;
  auVar169._10_2_ = uVar123;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar123;
  auVar168._0_8_ = uVar10;
  uVar123 = (undefined2)(uVar10 >> 0x10);
  auVar53._4_8_ = auVar168._8_8_;
  auVar53._2_2_ = uVar123;
  auVar53._0_2_ = uVar123;
  uVar11 = *(ulong *)(prim + uVar66 * 9 + 6);
  uVar123 = (undefined2)(uVar11 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._12_2_ = uVar123;
  auVar88._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar11 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar11;
  auVar87._10_2_ = uVar123;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar123;
  auVar86._0_8_ = uVar11;
  uVar123 = (undefined2)(uVar11 >> 0x10);
  auVar54._4_8_ = auVar86._8_8_;
  auVar54._2_2_ = uVar123;
  auVar54._0_2_ = uVar123;
  fVar154 = (float)(auVar54._0_4_ >> 0x10);
  fVar230 = (float)(auVar86._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar66 * 0xd + 6);
  uVar123 = (undefined2)(uVar12 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar12;
  auVar247._12_2_ = uVar123;
  auVar247._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar12 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar12;
  auVar246._10_2_ = uVar123;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar123;
  auVar245._0_8_ = uVar12;
  uVar123 = (undefined2)(uVar12 >> 0x10);
  auVar55._4_8_ = auVar245._8_8_;
  auVar55._2_2_ = uVar123;
  auVar55._0_2_ = uVar123;
  uVar13 = *(ulong *)(prim + uVar66 * 0x12 + 6);
  uVar123 = (undefined2)(uVar13 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar13;
  auVar91._12_2_ = uVar123;
  auVar91._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar13 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar13;
  auVar90._10_2_ = uVar123;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar123;
  auVar89._0_8_ = uVar13;
  uVar123 = (undefined2)(uVar13 >> 0x10);
  auVar56._4_8_ = auVar89._8_8_;
  auVar56._2_2_ = uVar123;
  auVar56._0_2_ = uVar123;
  fVar164 = (float)(auVar56._0_4_ >> 0x10);
  fVar231 = (float)(auVar89._8_4_ >> 0x10);
  uVar74 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  uVar14 = *(ulong *)(prim + uVar66 * 2 + uVar74 + 6);
  uVar123 = (undefined2)(uVar14 >> 0x30);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar14;
  auVar271._12_2_ = uVar123;
  auVar271._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar14 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar14;
  auVar270._10_2_ = uVar123;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar123;
  auVar269._0_8_ = uVar14;
  uVar123 = (undefined2)(uVar14 >> 0x10);
  auVar57._4_8_ = auVar269._8_8_;
  auVar57._2_2_ = uVar123;
  auVar57._0_2_ = uVar123;
  uVar74 = *(ulong *)(prim + uVar74 + 6);
  uVar123 = (undefined2)(uVar74 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar74;
  auVar94._12_2_ = uVar123;
  auVar94._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar74 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar74;
  auVar93._10_2_ = uVar123;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar123;
  auVar92._0_8_ = uVar74;
  uVar123 = (undefined2)(uVar74 >> 0x10);
  auVar58._4_8_ = auVar92._8_8_;
  auVar58._2_2_ = uVar123;
  auVar58._0_2_ = uVar123;
  fVar166 = (float)(auVar58._0_4_ >> 0x10);
  fVar232 = (float)(auVar92._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar66 * 0x18 + 6);
  uVar123 = (undefined2)(uVar15 >> 0x30);
  auVar285._8_4_ = 0;
  auVar285._0_8_ = uVar15;
  auVar285._12_2_ = uVar123;
  auVar285._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar15 >> 0x20);
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._8_2_ = 0;
  auVar284._0_8_ = uVar15;
  auVar284._10_2_ = uVar123;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._8_2_ = uVar123;
  auVar283._0_8_ = uVar15;
  uVar123 = (undefined2)(uVar15 >> 0x10);
  auVar59._4_8_ = auVar283._8_8_;
  auVar59._2_2_ = uVar123;
  auVar59._0_2_ = uVar123;
  uVar16 = *(ulong *)(prim + uVar66 * 0x1d + 6);
  uVar123 = (undefined2)(uVar16 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar16;
  auVar97._12_2_ = uVar123;
  auVar97._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar16 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar16;
  auVar96._10_2_ = uVar123;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar123;
  auVar95._0_8_ = uVar16;
  uVar123 = (undefined2)(uVar16 >> 0x10);
  auVar60._4_8_ = auVar95._8_8_;
  auVar60._2_2_ = uVar123;
  auVar60._0_2_ = uVar123;
  fVar183 = (float)(auVar60._0_4_ >> 0x10);
  fVar241 = (float)(auVar95._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar20 * 0x20 + 6);
  uVar123 = (undefined2)(uVar17 >> 0x30);
  auVar294._8_4_ = 0;
  auVar294._0_8_ = uVar17;
  auVar294._12_2_ = uVar123;
  auVar294._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar17 >> 0x20);
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._8_2_ = 0;
  auVar293._0_8_ = uVar17;
  auVar293._10_2_ = uVar123;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._8_2_ = uVar123;
  auVar292._0_8_ = uVar17;
  uVar123 = (undefined2)(uVar17 >> 0x10);
  auVar61._4_8_ = auVar292._8_8_;
  auVar61._2_2_ = uVar123;
  auVar61._0_2_ = uVar123;
  uVar18 = *(ulong *)(prim + ((ulong)(byte)PVar20 * 0x20 - uVar66) + 6);
  uVar123 = (undefined2)(uVar18 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar18;
  auVar100._12_2_ = uVar123;
  auVar100._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar18 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar18;
  auVar99._10_2_ = uVar123;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar123;
  auVar98._0_8_ = uVar18;
  uVar123 = (undefined2)(uVar18 >> 0x10);
  auVar62._4_8_ = auVar98._8_8_;
  auVar62._2_2_ = uVar123;
  auVar62._0_2_ = uVar123;
  fVar184 = (float)(auVar62._0_4_ >> 0x10);
  fVar242 = (float)(auVar98._8_4_ >> 0x10);
  uVar66 = *(ulong *)(prim + uVar66 * 0x23 + 6);
  uVar123 = (undefined2)(uVar66 >> 0x30);
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar66;
  auVar304._12_2_ = uVar123;
  auVar304._14_2_ = uVar123;
  uVar123 = (undefined2)(uVar66 >> 0x20);
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._8_2_ = 0;
  auVar303._0_8_ = uVar66;
  auVar303._10_2_ = uVar123;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._8_2_ = uVar123;
  auVar302._0_8_ = uVar66;
  uVar123 = (undefined2)(uVar66 >> 0x10);
  auVar63._4_8_ = auVar302._8_8_;
  auVar63._2_2_ = uVar123;
  auVar63._0_2_ = uVar123;
  auVar171._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar153) * fVar288 + fVar153) - fVar313) *
                fVar126,((((float)(int)(short)uVar10 - (float)(int)(short)uVar73) * fVar288 +
                         (float)(int)(short)uVar73) - fVar312) * fVar165);
  auVar171._8_4_ =
       ((((float)(auVar168._8_4_ >> 0x10) - fVar200) * fVar288 + fVar200) - fVar314) * fVar185;
  auVar171._12_4_ =
       ((((float)(auVar169._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar315) * fVar243;
  auVar248._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar288 +
        (float)(int)(short)uVar11) - fVar312) * fVar165;
  auVar248._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar154) * fVar288 + fVar154) - fVar313) * fVar126;
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar230) * fVar288 + fVar230) - fVar314) * fVar185;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar315) * fVar243;
  auVar272._0_8_ =
       CONCAT44(((((float)(auVar57._0_4_ >> 0x10) - fVar164) * fVar288 + fVar164) - fVar280) *
                fVar129,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar288 +
                         (float)(int)(short)uVar13) - fVar268) * fVar82);
  auVar272._8_4_ =
       ((((float)(auVar269._8_4_ >> 0x10) - fVar231) * fVar288 + fVar231) - fVar281) * fVar198;
  auVar272._12_4_ =
       ((((float)(auVar270._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar311) * fVar256;
  auVar286._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar74) * fVar288 +
        (float)(int)(short)uVar74) - fVar268) * fVar82;
  auVar286._4_4_ =
       ((((float)(auVar59._0_4_ >> 0x10) - fVar166) * fVar288 + fVar166) - fVar280) * fVar129;
  auVar286._8_4_ =
       ((((float)(auVar283._8_4_ >> 0x10) - fVar232) * fVar288 + fVar232) - fVar281) * fVar198;
  auVar286._12_4_ =
       ((((float)(auVar284._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar311) * fVar256;
  auVar295._0_8_ =
       CONCAT44(((((float)(auVar61._0_4_ >> 0x10) - fVar183) * fVar288 + fVar183) - fVar266) *
                fVar152,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar288 +
                         (float)(int)(short)uVar16) - fVar258) * fVar124);
  auVar295._8_4_ =
       ((((float)(auVar292._8_4_ >> 0x10) - fVar241) * fVar288 + fVar241) - fVar267) * fVar199;
  auVar295._12_4_ =
       ((((float)(auVar293._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar282) * fVar257;
  auVar305._0_4_ =
       ((((float)(int)(short)uVar66 - (float)(int)(short)uVar18) * fVar288 +
        (float)(int)(short)uVar18) - fVar258) * fVar124;
  auVar305._4_4_ =
       ((((float)(auVar63._0_4_ >> 0x10) - fVar184) * fVar288 + fVar184) - fVar266) * fVar152;
  auVar305._8_4_ =
       ((((float)(auVar302._8_4_ >> 0x10) - fVar242) * fVar288 + fVar242) - fVar267) * fVar199;
  auVar305._12_4_ =
       ((((float)(auVar303._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar282) * fVar257;
  auVar155._8_4_ = auVar171._8_4_;
  auVar155._0_8_ = auVar171._0_8_;
  auVar155._12_4_ = auVar171._12_4_;
  auVar156 = minps(auVar155,auVar248);
  auVar101._8_4_ = auVar272._8_4_;
  auVar101._0_8_ = auVar272._0_8_;
  auVar101._12_4_ = auVar272._12_4_;
  auVar84 = minps(auVar101,auVar286);
  auVar156 = maxps(auVar156,auVar84);
  auVar102._8_4_ = auVar295._8_4_;
  auVar102._0_8_ = auVar295._0_8_;
  auVar102._12_4_ = auVar295._12_4_;
  auVar84 = minps(auVar102,auVar305);
  uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar139._4_4_ = uVar65;
  auVar139._0_4_ = uVar65;
  auVar139._8_4_ = uVar65;
  auVar139._12_4_ = uVar65;
  auVar84 = maxps(auVar84,auVar139);
  auVar84 = maxps(auVar156,auVar84);
  auVar156 = maxps(auVar171,auVar248);
  auVar273 = maxps(auVar272,auVar286);
  auVar156 = minps(auVar156,auVar273);
  local_218 = auVar84._0_4_ * 0.99999964;
  fStack_214 = auVar84._4_4_ * 0.99999964;
  fStack_210 = auVar84._8_4_ * 0.99999964;
  fStack_20c = auVar84._12_4_ * 0.99999964;
  auVar84 = maxps(auVar295,auVar305);
  fVar165 = (ray->super_RayK<1>).tfar;
  auVar103._4_4_ = fVar165;
  auVar103._0_4_ = fVar165;
  auVar103._8_4_ = fVar165;
  auVar103._12_4_ = fVar165;
  auVar84 = minps(auVar84,auVar103);
  auVar84 = minps(auVar156,auVar84);
  uVar77 = (uint)(byte)PVar20;
  auVar140._0_4_ = -(uint)(uVar77 != 0 && local_218 <= auVar84._0_4_ * 1.0000004);
  auVar140._4_4_ = -(uint)(1 < uVar77 && fStack_214 <= auVar84._4_4_ * 1.0000004);
  auVar140._8_4_ = -(uint)(2 < uVar77 && fStack_210 <= auVar84._8_4_ * 1.0000004);
  auVar140._12_4_ = -(uint)(3 < uVar77 && fStack_20c <= auVar84._12_4_ * 1.0000004);
  uVar77 = movmskps(uVar77,auVar140);
  if (uVar77 == 0) {
    return;
  }
  uVar77 = uVar77 & 0xff;
  local_1a8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1a8._12_4_ = 0;
  local_330 = prim;
LAB_00af7582:
  lVar76 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar78 = *(uint *)(local_330 + 2);
  pRVar71 = (RTCIntersectArguments *)(ulong)uVar78;
  uVar79 = *(uint *)(local_330 + lVar76 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[(long)pRVar71].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                           (ulong)uVar79 *
                           pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4e8 = pGVar21->fnumTimeSegments;
  fVar165 = (pGVar21->time_range).lower;
  fVar82 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar165) /
           ((pGVar21->time_range).upper - fVar165)) * local_4e8;
  fVar165 = floorf(fVar82);
  if (local_4e8 + -1.0 <= fVar165) {
    fVar165 = local_4e8 + -1.0;
  }
  fVar124 = 0.0;
  if (0.0 <= fVar165) {
    fVar124 = fVar165;
  }
  fVar82 = fVar82 - fVar124;
  fVar153 = 1.0 - fVar82;
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)fVar124 * 0x38;
  lVar76 = *(long *)(_Var22 + lVar75);
  lVar23 = *(long *)(_Var22 + 0x10 + lVar75);
  pRVar70 = (RTCIntersectArguments *)(lVar23 * (uVar73 + 3));
  lVar24 = *(long *)(_Var22 + 0x38 + lVar75);
  lVar75 = *(long *)(_Var22 + 0x48 + lVar75);
  pfVar1 = (float *)(lVar24 + uVar73 * lVar75);
  pfVar2 = (float *)(lVar76 + lVar23 * uVar73);
  local_158 = *pfVar2 * fVar153 + *pfVar1 * fVar82;
  local_248 = pfVar2[1] * fVar153 + pfVar1[1] * fVar82;
  local_258 = pfVar2[2] * fVar153 + pfVar1[2] * fVar82;
  pfVar3 = (float *)(lVar24 + (uVar73 + 1) * lVar75);
  pfVar4 = (float *)(lVar76 + lVar23 * (uVar73 + 1));
  local_278 = *pfVar4 * fVar153 + *pfVar3 * fVar82;
  local_288 = pfVar4[1] * fVar153 + pfVar3[1] * fVar82;
  local_298 = pfVar4[2] * fVar153 + pfVar3[2] * fVar82;
  pfVar5 = (float *)(lVar24 + (uVar73 + 2) * lVar75);
  pfVar6 = (float *)(lVar76 + lVar23 * (uVar73 + 2));
  local_2a8 = *pfVar6 * fVar153 + *pfVar5 * fVar82;
  local_2b8 = pfVar6[1] * fVar153 + pfVar5[1] * fVar82;
  local_2c8 = pfVar6[2] * fVar153 + pfVar5[2] * fVar82;
  pfVar7 = (float *)(lVar24 + lVar75 * (uVar73 + 3));
  pfVar8 = (float *)((long)&pRVar70->flags + lVar76);
  local_4e8 = fVar153 * *pfVar8 + fVar82 * *pfVar7;
  fStack_4e4 = fVar153 * pfVar8[1] + fVar82 * pfVar7[1];
  fStack_4e0 = fVar153 * pfVar8[2] + fVar82 * pfVar7[2];
  fVar165 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar124 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar126 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_308 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3c8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_548 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar129 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_308 * local_308;
  fVar154 = local_3c8 * local_3c8;
  fVar164 = local_548 * local_548;
  fVar129 = fVar129 * fVar129;
  fVar152 = fStack_13c + fVar154 + fVar164;
  auVar186._0_8_ = CONCAT44(fVar154 + fVar154 + fVar129,fVar152);
  auVar186._8_4_ = fVar164 + fVar154 + fVar164;
  auVar186._12_4_ = fVar129 + fVar154 + fVar129;
  auVar172._8_4_ = auVar186._8_4_;
  auVar172._0_8_ = auVar186._0_8_;
  auVar172._12_4_ = auVar186._12_4_;
  auVar84 = rcpss(auVar172,auVar186);
  local_508 = (2.0 - fVar152 * auVar84._0_4_) * auVar84._0_4_ *
              (((local_258 + local_298 + local_2c8 + fStack_4e0) * 0.25 - fVar126) * local_548 +
              ((local_248 + local_288 + local_2b8 + fStack_4e4) * 0.25 - fVar124) * local_3c8 +
              ((local_158 + local_278 + local_2a8 + local_4e8) * 0.25 - fVar165) * local_308);
  local_358 = ZEXT416((uint)local_508);
  fVar165 = local_308 * local_508 + fVar165;
  fVar124 = local_3c8 * local_508 + fVar124;
  fVar126 = local_548 * local_508 + fVar126;
  local_158 = local_158 - fVar165;
  local_248 = local_248 - fVar124;
  local_258 = local_258 - fVar126;
  fStack_38c = (pfVar2[3] * fVar153 + pfVar1[3] * fVar82) - 0.0;
  local_2a8 = local_2a8 - fVar165;
  local_2b8 = local_2b8 - fVar124;
  local_2c8 = local_2c8 - fVar126;
  fStack_3ac = (pfVar6[3] * fVar153 + pfVar5[3] * fVar82) - 0.0;
  local_278 = local_278 - fVar165;
  local_288 = local_288 - fVar124;
  local_298 = local_298 - fVar126;
  fStack_39c = (pfVar4[3] * fVar153 + pfVar3[3] * fVar82) - 0.0;
  local_4e8 = local_4e8 - fVar165;
  fStack_4e4 = fStack_4e4 - fVar124;
  fStack_4e0 = fStack_4e0 - fVar126;
  fStack_4dc = (fVar153 * pfVar8[3] + fVar82 * pfVar7[3]) - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  local_398 = local_158;
  fStack_394 = local_248;
  fStack_390 = local_258;
  local_268 = fStack_38c;
  fStack_264 = fStack_38c;
  fStack_260 = fStack_38c;
  fStack_25c = fStack_38c;
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  fStack_284 = local_288;
  fStack_280 = local_288;
  fStack_27c = local_288;
  fStack_294 = local_298;
  fStack_290 = local_298;
  fStack_28c = local_298;
  local_148 = fStack_13c + fVar164 + fVar154;
  fStack_144 = fStack_13c + fVar164 + fVar154;
  fStack_140 = fStack_13c + fVar164 + fVar154;
  fStack_13c = fStack_13c + fVar164 + fVar154;
  local_3a8 = local_278;
  fStack_3a4 = local_288;
  fStack_3a0 = local_298;
  local_168 = fStack_39c;
  fStack_164 = fStack_39c;
  fStack_160 = fStack_39c;
  fStack_15c = fStack_39c;
  fStack_2a4 = local_2a8;
  fStack_2a0 = local_2a8;
  fStack_29c = local_2a8;
  fStack_2b4 = local_2b8;
  fStack_2b0 = local_2b8;
  fStack_2ac = local_2b8;
  fStack_2c4 = local_2c8;
  fStack_2c0 = local_2c8;
  fStack_2bc = local_2c8;
  local_3b8 = local_2a8;
  fStack_3b4 = local_2b8;
  fStack_3b0 = local_2c8;
  local_2d8 = fStack_3ac;
  fStack_2d4 = fStack_3ac;
  fStack_2d0 = fStack_3ac;
  fStack_2cc = fStack_3ac;
  local_2e8 = fStack_4e0;
  fStack_2e4 = fStack_4e0;
  fStack_2e0 = fStack_4e0;
  fStack_2dc = fStack_4e0;
  local_2f8 = fStack_4dc;
  fStack_2f4 = fStack_4dc;
  fStack_2f0 = fStack_4dc;
  fStack_2ec = fStack_4dc;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  fStack_3c4 = local_3c8;
  fStack_3c0 = local_3c8;
  fStack_3bc = local_3c8;
  local_318 = ABS(local_148);
  fStack_314 = ABS(fStack_144);
  fStack_310 = ABS(fStack_140);
  fStack_30c = ABS(fStack_13c);
  fVar165 = 1.4013e-45;
  uVar73 = 0;
  local_198 = 0.0;
  fStack_194 = 1.0;
  local_1d8 = local_4e8;
  fStack_1d4 = local_4e8;
  fStack_1d0 = local_4e8;
  fStack_1cc = local_4e8;
  local_1e8 = fStack_4e4;
  fStack_1e4 = fStack_4e4;
  fStack_1e0 = fStack_4e4;
  fStack_1dc = fStack_4e4;
  fStack_544 = local_548;
  fStack_540 = local_548;
  fStack_53c = local_548;
  fStack_504 = local_508;
  fStack_500 = local_508;
  fStack_4fc = local_508;
  do {
    uVar65 = SUB84(pRVar70,0);
    iVar72 = (int)uVar73;
    local_468 = fStack_194 - local_198;
    fVar152 = local_468 * 0.11111111;
    uStack_190 = 0;
    uStack_18c = 0;
    fStack_464 = local_468;
    fStack_460 = local_468;
    fStack_45c = local_468;
    local_488 = local_198;
    fStack_484 = local_198;
    fStack_480 = local_198;
    fStack_47c = local_198;
    fVar242 = local_468 * 0.0 + local_198;
    fVar243 = local_468 * 0.33333334 + local_198;
    fVar256 = local_468 * 0.6666667 + local_198;
    fVar257 = local_468 * 1.0 + local_198;
    fVar230 = 1.0 - fVar242;
    fVar231 = 1.0 - fVar243;
    fVar232 = 1.0 - fVar256;
    fVar241 = 1.0 - fVar257;
    fVar82 = fVar242 * fVar230;
    fVar124 = fVar243 * fVar231;
    fVar126 = fVar256 * fVar232;
    fVar129 = fVar257 * fVar241;
    fVar153 = fVar230 * fVar230 * fVar230;
    fVar164 = fVar231 * fVar231 * fVar231;
    fVar183 = fVar232 * fVar232 * fVar232;
    fVar184 = fVar241 * fVar241 * fVar241;
    fVar258 = fVar242 * fVar242 * fVar242;
    fVar266 = fVar243 * fVar243 * fVar243;
    fVar267 = fVar256 * fVar256 * fVar256;
    fVar282 = fVar257 * fVar257 * fVar257;
    fVar154 = fVar153 * 0.16666667;
    fVar166 = fVar164 * 0.16666667;
    fVar185 = fVar183 * 0.16666667;
    fVar198 = fVar184 * 0.16666667;
    fVar268 = (fVar242 * fVar82 * 6.0 + fVar230 * fVar82 * 12.0 + fVar153 * 4.0 + fVar258) *
              0.16666667;
    fVar280 = (fVar243 * fVar124 * 6.0 + fVar231 * fVar124 * 12.0 + fVar164 * 4.0 + fVar266) *
              0.16666667;
    fVar281 = (fVar256 * fVar126 * 6.0 + fVar232 * fVar126 * 12.0 + fVar183 * 4.0 + fVar267) *
              0.16666667;
    fVar311 = (fVar257 * fVar129 * 6.0 + fVar241 * fVar129 * 12.0 + fVar184 * 4.0 + fVar282) *
              0.16666667;
    fVar153 = (fVar230 * fVar82 * 6.0 + fVar242 * fVar82 * 12.0 + fVar258 * 4.0 + fVar153) *
              0.16666667;
    fVar164 = (fVar231 * fVar124 * 6.0 + fVar243 * fVar124 * 12.0 + fVar266 * 4.0 + fVar164) *
              0.16666667;
    fVar199 = (fVar232 * fVar126 * 6.0 + fVar256 * fVar126 * 12.0 + fVar267 * 4.0 + fVar183) *
              0.16666667;
    fVar200 = (fVar241 * fVar129 * 6.0 + fVar257 * fVar129 * 12.0 + fVar282 * 4.0 + fVar184) *
              0.16666667;
    fVar258 = fVar258 * 0.16666667;
    fVar266 = fVar266 * 0.16666667;
    fVar267 = fVar267 * 0.16666667;
    fVar282 = fVar282 * 0.16666667;
    fVar298 = local_158 * fVar154 + local_278 * fVar268 + local_2a8 * fVar153 + local_1d8 * fVar258;
    fVar299 = fStack_154 * fVar166 +
              fStack_274 * fVar280 + fStack_2a4 * fVar164 + fStack_1d4 * fVar266;
    fVar300 = fStack_150 * fVar185 +
              fStack_270 * fVar281 + fStack_2a0 * fVar199 + fStack_1d0 * fVar267;
    fVar308 = fStack_14c * fVar198 +
              fStack_26c * fVar311 + fStack_29c * fVar200 + fStack_1cc * fVar282;
    fVar309 = local_248 * fVar154 + local_288 * fVar268 + local_2b8 * fVar153 + local_1e8 * fVar258;
    fVar310 = fStack_244 * fVar166 +
              fStack_284 * fVar280 + fStack_2b4 * fVar164 + fStack_1e4 * fVar266;
    fVar312 = fStack_240 * fVar185 +
              fStack_280 * fVar281 + fStack_2b0 * fVar199 + fStack_1e0 * fVar267;
    fVar313 = fStack_23c * fVar198 +
              fStack_27c * fVar311 + fStack_2ac * fVar200 + fStack_1dc * fVar282;
    local_4f8 = local_258 * fVar154 +
                local_298 * fVar268 + local_2c8 * fVar153 + local_2e8 * fVar258;
    fStack_4f4 = fStack_254 * fVar166 +
                 fStack_294 * fVar280 + fStack_2c4 * fVar164 + fStack_2e4 * fVar266;
    fStack_4f0 = fStack_250 * fVar185 +
                 fStack_290 * fVar281 + fStack_2c0 * fVar199 + fStack_2e0 * fVar267;
    fStack_4ec = fStack_24c * fVar198 +
                 fStack_28c * fVar311 + fStack_2bc * fVar200 + fStack_2dc * fVar282;
    fVar183 = fVar154 * local_268 + fVar268 * local_168 + fVar153 * local_2d8 + fVar258 * local_2f8;
    fVar184 = fVar166 * fStack_264 +
              fVar280 * fStack_164 + fVar164 * fStack_2d4 + fVar266 * fStack_2f4;
    auVar157._0_8_ = CONCAT44(fVar184,fVar183);
    auVar157._8_4_ =
         fVar185 * fStack_260 + fVar281 * fStack_160 + fVar199 * fStack_2d0 + fVar267 * fStack_2f0;
    auVar157._12_4_ =
         fVar198 * fStack_25c + fVar311 * fStack_15c + fVar200 * fStack_2cc + fVar282 * fStack_2ec;
    fVar153 = -fVar230 * fVar230 * 0.5;
    fVar154 = -fVar231 * fVar231 * 0.5;
    fVar164 = -fVar232 * fVar232 * 0.5;
    fVar166 = -fVar241 * fVar241 * 0.5;
    fVar185 = (-fVar242 * fVar242 - fVar82 * 4.0) * 0.5;
    fVar198 = (-fVar243 * fVar243 - fVar124 * 4.0) * 0.5;
    fVar199 = (-fVar256 * fVar256 - fVar126 * 4.0) * 0.5;
    fVar200 = (-fVar257 * fVar257 - fVar129 * 4.0) * 0.5;
    fVar82 = (fVar82 * 4.0 + fVar230 * fVar230) * 0.5;
    fVar124 = (fVar124 * 4.0 + fVar231 * fVar231) * 0.5;
    fVar126 = (fVar126 * 4.0 + fVar232 * fVar232) * 0.5;
    fVar129 = (fVar129 * 4.0 + fVar241 * fVar241) * 0.5;
    fVar230 = fVar242 * fVar242 * 0.5;
    fVar231 = fVar243 * fVar243 * 0.5;
    fVar232 = fVar256 * fVar256 * 0.5;
    fVar241 = fVar257 * fVar257 * 0.5;
    local_418._0_4_ =
         (local_158 * fVar153 + local_278 * fVar185 + local_2a8 * fVar82 + local_1d8 * fVar230) *
         fVar152;
    local_418._4_4_ =
         (fStack_154 * fVar154 + fStack_274 * fVar198 + fStack_2a4 * fVar124 + fStack_1d4 * fVar231)
         * fVar152;
    fStack_410 = (fStack_150 * fVar164 +
                 fStack_270 * fVar199 + fStack_2a0 * fVar126 + fStack_1d0 * fVar232) * fVar152;
    fStack_40c = (fStack_14c * fVar166 +
                 fStack_26c * fVar200 + fStack_29c * fVar129 + fStack_1cc * fVar241) * fVar152;
    fVar311 = (local_248 * fVar153 + local_288 * fVar185 + local_2b8 * fVar82 + local_1e8 * fVar230)
              * fVar152;
    local_3f8 = (fStack_244 * fVar154 +
                fStack_284 * fVar198 + fStack_2b4 * fVar124 + fStack_1e4 * fVar231) * fVar152;
    fStack_3f4 = (fStack_240 * fVar164 +
                 fStack_280 * fVar199 + fStack_2b0 * fVar126 + fStack_1e0 * fVar232) * fVar152;
    fStack_3f0 = (fStack_23c * fVar166 +
                 fStack_27c * fVar200 + fStack_2ac * fVar129 + fStack_1dc * fVar241) * fVar152;
    local_3e8 = (local_258 * fVar153 +
                local_298 * fVar185 + local_2c8 * fVar82 + local_2e8 * fVar230) * fVar152;
    fStack_3e4 = (fStack_254 * fVar154 +
                 fStack_294 * fVar198 + fStack_2c4 * fVar124 + fStack_2e4 * fVar231) * fVar152;
    fStack_3e0 = (fStack_250 * fVar164 +
                 fStack_290 * fVar199 + fStack_2c0 * fVar126 + fStack_2e0 * fVar232) * fVar152;
    fStack_3dc = (fStack_24c * fVar166 +
                 fStack_28c * fVar200 + fStack_2bc * fVar129 + fStack_2dc * fVar241) * fVar152;
    fVar124 = fVar152 * (fVar154 * fStack_264 +
                        fVar198 * fStack_164 + fVar124 * fStack_2d4 + fVar231 * fStack_2f4);
    fVar126 = fVar152 * (fVar164 * fStack_260 +
                        fVar199 * fStack_160 + fVar126 * fStack_2d0 + fVar232 * fStack_2f0);
    fVar129 = fVar152 * (fVar166 * fStack_25c +
                        fVar200 * fStack_15c + fVar129 * fStack_2cc + fVar241 * fStack_2ec);
    auVar104._4_4_ = fVar312;
    auVar104._0_4_ = fVar310;
    auVar104._8_4_ = fVar313;
    auVar104._12_4_ = 0;
    auVar141._4_4_ = auVar157._8_4_;
    auVar141._0_4_ = fVar184;
    auVar141._8_4_ = auVar157._12_4_;
    auVar141._12_4_ = 0;
    auVar173._0_8_ = CONCAT44(auVar157._8_4_ - fVar126,fVar184 - fVar124);
    auVar173._8_4_ = auVar157._12_4_ - fVar129;
    auVar173._12_4_ = 0;
    local_368._0_4_ = fVar310 - fVar309;
    local_368._4_4_ = fVar312 - fVar310;
    fStack_360 = fVar313 - fVar312;
    fStack_35c = 0.0 - fVar313;
    local_378._0_4_ = fStack_4f4 - local_4f8;
    local_378._4_4_ = fStack_4f0 - fStack_4f4;
    fStack_370 = fStack_4ec - fStack_4f0;
    fStack_36c = 0.0 - fStack_4ec;
    fVar154 = fVar311 * (float)local_378._0_4_ - local_3e8 * (float)local_368._0_4_;
    fVar164 = local_3f8 * (float)local_378._4_4_ - fStack_3e4 * (float)local_368._4_4_;
    fVar166 = fStack_3f4 * fStack_370 - fStack_3e0 * fStack_360;
    fVar198 = fStack_3f0 * fStack_36c - fStack_3dc * fStack_35c;
    local_388 = fVar299 - fVar298;
    fStack_384 = fVar300 - fVar299;
    fStack_380 = fVar308 - fVar300;
    fStack_37c = 0.0 - fVar308;
    fVar199 = local_3e8 * local_388 - (float)local_418._0_4_ * (float)local_378._0_4_;
    fVar231 = fStack_3e4 * fStack_384 - (float)local_418._4_4_ * (float)local_378._4_4_;
    fVar241 = fStack_3e0 * fStack_380 - fStack_410 * fStack_370;
    fVar243 = fStack_3dc * fStack_37c - fStack_40c * fStack_36c;
    fVar200 = (float)local_418._0_4_ * (float)local_368._0_4_ - fVar311 * local_388;
    fVar232 = (float)local_418._4_4_ * (float)local_368._4_4_ - local_3f8 * fStack_384;
    fVar242 = fStack_410 * fStack_360 - fStack_3f4 * fStack_380;
    fVar256 = fStack_40c * fStack_35c - fStack_3f0 * fStack_37c;
    auVar259._0_4_ = fVar200 * fVar200;
    auVar259._4_4_ = fVar232 * fVar232;
    auVar259._8_4_ = fVar242 * fVar242;
    auVar259._12_4_ = fVar256 * fVar256;
    auVar217._0_4_ =
         local_388 * local_388 +
         (float)local_368._0_4_ * (float)local_368._0_4_ +
         (float)local_378._0_4_ * (float)local_378._0_4_;
    auVar217._4_4_ =
         fStack_384 * fStack_384 +
         (float)local_368._4_4_ * (float)local_368._4_4_ +
         (float)local_378._4_4_ * (float)local_378._4_4_;
    auVar217._8_4_ = fStack_380 * fStack_380 + fStack_360 * fStack_360 + fStack_370 * fStack_370;
    auVar217._12_4_ = fStack_37c * fStack_37c + fStack_35c * fStack_35c + fStack_36c * fStack_36c;
    auVar84 = rcpps(auVar259,auVar217);
    fVar200 = auVar84._0_4_;
    fVar232 = auVar84._4_4_;
    fVar242 = auVar84._8_4_;
    fVar256 = auVar84._12_4_;
    fVar200 = (1.0 - fVar200 * auVar217._0_4_) * fVar200 + fVar200;
    fVar232 = (1.0 - fVar232 * auVar217._4_4_) * fVar232 + fVar232;
    fVar242 = (1.0 - fVar242 * auVar217._8_4_) * fVar242 + fVar242;
    fVar256 = (1.0 - fVar256 * auVar217._12_4_) * fVar256 + fVar256;
    fVar257 = (float)local_378._0_4_ * local_3f8 - (float)local_368._0_4_ * fStack_3e4;
    fVar268 = (float)local_378._4_4_ * fStack_3f4 - (float)local_368._4_4_ * fStack_3e0;
    fVar280 = fStack_370 * fStack_3f0 - fStack_360 * fStack_3dc;
    fVar281 = fStack_36c * 0.0 - fStack_35c * 0.0;
    local_408._4_4_ = fStack_3e0;
    local_408._0_4_ = fStack_3e4;
    fStack_400 = fStack_3dc;
    fStack_3fc = 0.0;
    fVar258 = local_388 * fStack_3e4 - (float)local_378._0_4_ * (float)local_418._4_4_;
    fVar266 = fStack_384 * fStack_3e0 - (float)local_378._4_4_ * fStack_410;
    fVar267 = fStack_380 * fStack_3dc - fStack_370 * fStack_40c;
    fVar282 = fStack_37c * 0.0 - fStack_36c * 0.0;
    uStack_3ec = 0;
    local_438 = (float)local_418._4_4_;
    fStack_434 = fStack_410;
    fStack_430 = fStack_40c;
    fStack_42c = 0.0;
    fVar288 = (float)local_368._0_4_ * (float)local_418._4_4_ - local_388 * local_3f8;
    fVar289 = (float)local_368._4_4_ * fStack_410 - fStack_384 * fStack_3f4;
    fVar290 = fStack_360 * fStack_40c - fStack_380 * fStack_3f0;
    fVar297 = fStack_35c * 0.0 - fStack_37c * 0.0;
    auVar234._0_4_ = (fVar154 * fVar154 + fVar199 * fVar199 + auVar259._0_4_) * fVar200;
    auVar234._4_4_ = (fVar164 * fVar164 + fVar231 * fVar231 + auVar259._4_4_) * fVar232;
    auVar234._8_4_ = (fVar166 * fVar166 + fVar241 * fVar241 + auVar259._8_4_) * fVar242;
    auVar234._12_4_ = (fVar198 * fVar198 + fVar243 * fVar243 + auVar259._12_4_) * fVar256;
    auVar274._0_4_ = (fVar257 * fVar257 + fVar258 * fVar258 + fVar288 * fVar288) * fVar200;
    auVar274._4_4_ = (fVar268 * fVar268 + fVar266 * fVar266 + fVar289 * fVar289) * fVar232;
    auVar274._8_4_ = (fVar280 * fVar280 + fVar267 * fVar267 + fVar290 * fVar290) * fVar242;
    auVar274._12_4_ = (fVar281 * fVar281 + fVar282 * fVar282 + fVar297 * fVar297) * fVar256;
    auVar235 = maxps(auVar234,auVar274);
    auVar260._0_8_ =
         CONCAT44(fVar124 + fVar184,
                  fVar152 * (fVar153 * local_268 +
                            fVar185 * local_168 + fVar82 * local_2d8 + fVar230 * local_2f8) +
                  fVar183);
    auVar260._8_4_ = fVar126 + auVar157._8_4_;
    auVar260._12_4_ = fVar129 + auVar157._12_4_;
    auVar249._8_4_ = auVar157._8_4_;
    auVar249._0_8_ = auVar157._0_8_;
    auVar249._12_4_ = auVar157._12_4_;
    auVar84 = maxps(auVar249,auVar260);
    auVar275._8_4_ = auVar260._8_4_;
    auVar275._0_8_ = auVar260._0_8_;
    auVar275._12_4_ = auVar260._12_4_;
    auVar261._8_4_ = auVar173._8_4_;
    auVar261._0_8_ = auVar173._0_8_;
    auVar261._12_4_ = 0;
    auVar156 = maxps(auVar261,auVar141);
    auVar250 = maxps(auVar84,auVar156);
    auVar84 = minps(auVar157,auVar275);
    auVar156 = minps(auVar173,auVar141);
    auVar273 = minps(auVar84,auVar156);
    auVar84 = sqrtps(auVar141,auVar235);
    auVar156 = rsqrtps(auVar84,auVar217);
    fVar82 = auVar156._0_4_;
    fVar124 = auVar156._4_4_;
    fVar126 = auVar156._8_4_;
    fVar129 = auVar156._12_4_;
    local_178 = fVar82 * 1.5 - fVar82 * fVar82 * auVar217._0_4_ * 0.5 * fVar82;
    fStack_174 = fVar124 * 1.5 - fVar124 * fVar124 * auVar217._4_4_ * 0.5 * fVar124;
    fStack_170 = fVar126 * 1.5 - fVar126 * fVar126 * auVar217._8_4_ * 0.5 * fVar126;
    fStack_16c = fVar129 * 1.5 - fVar129 * fVar129 * auVar217._12_4_ * 0.5 * fVar129;
    local_448 = 0.0 - fVar309;
    fStack_444 = 0.0 - fVar310;
    fStack_440 = 0.0 - fVar312;
    fStack_43c = 0.0 - fVar313;
    local_458._0_4_ = 0.0 - local_4f8;
    local_458._4_4_ = 0.0 - fStack_4f4;
    fStack_450 = 0.0 - fStack_4f0;
    fStack_44c = 0.0 - fStack_4ec;
    local_428 = 0.0 - fVar298;
    fStack_424 = 0.0 - fVar299;
    fStack_420 = 0.0 - fVar300;
    fStack_41c = 0.0 - fVar308;
    auVar236._0_4_ =
         local_3c8 * (float)local_368._0_4_ * local_178 +
         local_548 * (float)local_378._0_4_ * local_178;
    auVar236._4_4_ =
         fStack_3c4 * (float)local_368._4_4_ * fStack_174 +
         fStack_544 * (float)local_378._4_4_ * fStack_174;
    auVar236._8_4_ = fStack_3c0 * fStack_360 * fStack_170 + fStack_540 * fStack_370 * fStack_170;
    auVar236._12_4_ = fStack_3bc * fStack_35c * fStack_16c + fStack_53c * fStack_36c * fStack_16c;
    fVar82 = local_308 * local_388 * local_178 + auVar236._0_4_;
    fVar124 = fStack_304 * fStack_384 * fStack_174 + auVar236._4_4_;
    fVar126 = fStack_300 * fStack_380 * fStack_170 + auVar236._8_4_;
    fVar129 = fStack_2fc * fStack_37c * fStack_16c + auVar236._12_4_;
    local_188 = local_388 * local_178 * local_428 +
                (float)local_368._0_4_ * local_178 * local_448 +
                (float)local_378._0_4_ * local_178 * (float)local_458._0_4_;
    fStack_184 = fStack_384 * fStack_174 * fStack_424 +
                 (float)local_368._4_4_ * fStack_174 * fStack_444 +
                 (float)local_378._4_4_ * fStack_174 * (float)local_458._4_4_;
    fStack_180 = fStack_380 * fStack_170 * fStack_420 +
                 fStack_360 * fStack_170 * fStack_440 + fStack_370 * fStack_170 * fStack_450;
    fStack_17c = fStack_37c * fStack_16c * fStack_41c +
                 fStack_35c * fStack_16c * fStack_43c + fStack_36c * fStack_16c * fStack_44c;
    local_518._0_4_ =
         (local_308 * local_428 + local_3c8 * local_448 + local_548 * (float)local_458._0_4_) -
         fVar82 * local_188;
    local_518._4_4_ =
         (fStack_304 * fStack_424 + fStack_3c4 * fStack_444 + fStack_544 * (float)local_458._4_4_) -
         fVar124 * fStack_184;
    fStack_510 = (fStack_300 * fStack_420 + fStack_3c0 * fStack_440 + fStack_540 * fStack_450) -
                 fVar126 * fStack_180;
    fStack_50c = (fStack_2fc * fStack_41c + fStack_3bc * fStack_43c + fStack_53c * fStack_44c) -
                 fVar129 * fStack_17c;
    fVar231 = (local_428 * local_428 +
              local_448 * local_448 + (float)local_458._0_4_ * (float)local_458._0_4_) -
              local_188 * local_188;
    fVar232 = (fStack_424 * fStack_424 +
              fStack_444 * fStack_444 + (float)local_458._4_4_ * (float)local_458._4_4_) -
              fStack_184 * fStack_184;
    fVar241 = (fStack_420 * fStack_420 + fStack_440 * fStack_440 + fStack_450 * fStack_450) -
              fStack_180 * fStack_180;
    fVar242 = (fStack_41c * fStack_41c + fStack_43c * fStack_43c + fStack_44c * fStack_44c) -
              fStack_17c * fStack_17c;
    fVar152 = (auVar250._0_4_ + auVar84._0_4_) * 1.0000002;
    fVar153 = (auVar250._4_4_ + auVar84._4_4_) * 1.0000002;
    fVar154 = (auVar250._8_4_ + auVar84._8_4_) * 1.0000002;
    fVar164 = (auVar250._12_4_ + auVar84._12_4_) * 1.0000002;
    fVar243 = fVar231 - fVar152 * fVar152;
    fVar256 = fVar232 - fVar153 * fVar153;
    fVar257 = fVar241 - fVar154 * fVar154;
    fVar268 = fVar242 - fVar164 * fVar164;
    fVar152 = fVar82 * fVar82;
    fVar153 = fVar124 * fVar124;
    fVar154 = fVar126 * fVar126;
    fVar164 = fVar129 * fVar129;
    fVar166 = local_148 - fVar152;
    fVar183 = fStack_144 - fVar153;
    fVar184 = fStack_140 - fVar154;
    fVar185 = fStack_13c - fVar164;
    local_518._0_4_ = (float)local_518._0_4_ + (float)local_518._0_4_;
    local_518._4_4_ = (float)local_518._4_4_ + (float)local_518._4_4_;
    fStack_510 = fStack_510 + fStack_510;
    fStack_50c = fStack_50c + fStack_50c;
    fVar198 = fVar166 * 4.0;
    fVar199 = fVar183 * 4.0;
    fVar200 = fVar184 * 4.0;
    fVar230 = fVar185 * 4.0;
    auVar142._0_4_ = (float)local_518._0_4_ * (float)local_518._0_4_ - fVar198 * fVar243;
    auVar142._4_4_ = (float)local_518._4_4_ * (float)local_518._4_4_ - fVar199 * fVar256;
    auVar142._8_4_ = fStack_510 * fStack_510 - fVar200 * fVar257;
    auVar142._12_4_ = fStack_50c * fStack_50c - fVar230 * fVar268;
    local_498._0_4_ = (auVar273._0_4_ - auVar84._0_4_) * 0.99999976;
    local_498._4_4_ = (auVar273._4_4_ - auVar84._4_4_) * 0.99999976;
    local_498._8_4_ = (auVar273._8_4_ - auVar84._8_4_) * 0.99999976;
    local_498._12_4_ = (auVar273._12_4_ - auVar84._12_4_) * 0.99999976;
    auVar174._4_4_ = -(uint)(0.0 <= auVar142._4_4_);
    auVar174._0_4_ = -(uint)(0.0 <= auVar142._0_4_);
    auVar174._8_4_ = -(uint)(0.0 <= auVar142._8_4_);
    auVar174._12_4_ = -(uint)(0.0 <= auVar142._12_4_);
    uVar69 = (undefined4)((ulong)lVar76 >> 0x20);
    iVar64 = movmskps((int)lVar76,auVar174);
    if (iVar64 == 0) {
      iVar64 = 0;
      auVar237 = _DAT_01f7aa00;
      auVar262 = _DAT_01f7a9f0;
    }
    else {
      auVar84 = sqrtps(local_498,auVar142);
      bVar25 = 0.0 <= auVar142._0_4_;
      uVar80 = -(uint)bVar25;
      bVar26 = 0.0 <= auVar142._4_4_;
      uVar83 = -(uint)bVar26;
      bVar27 = 0.0 <= auVar142._8_4_;
      uVar125 = -(uint)bVar27;
      bVar28 = 0.0 <= auVar142._12_4_;
      uVar127 = -(uint)bVar28;
      auVar218._0_4_ = fVar166 + fVar166;
      auVar218._4_4_ = fVar183 + fVar183;
      auVar218._8_4_ = fVar184 + fVar184;
      auVar218._12_4_ = fVar185 + fVar185;
      auVar156 = rcpps(auVar236,auVar218);
      fVar280 = auVar156._0_4_;
      fVar281 = auVar156._4_4_;
      fVar258 = auVar156._8_4_;
      fVar266 = auVar156._12_4_;
      fVar280 = (1.0 - auVar218._0_4_ * fVar280) * fVar280 + fVar280;
      fVar281 = (1.0 - auVar218._4_4_ * fVar281) * fVar281 + fVar281;
      fVar258 = (1.0 - auVar218._8_4_ * fVar258) * fVar258 + fVar258;
      fVar266 = (1.0 - auVar218._12_4_ * fVar266) * fVar266 + fVar266;
      fVar267 = (-(float)local_518._0_4_ - auVar84._0_4_) * fVar280;
      fVar282 = (-(float)local_518._4_4_ - auVar84._4_4_) * fVar281;
      fVar288 = (-fStack_510 - auVar84._8_4_) * fVar258;
      fVar289 = (-fStack_50c - auVar84._12_4_) * fVar266;
      fVar280 = (auVar84._0_4_ - (float)local_518._0_4_) * fVar280;
      fVar281 = (auVar84._4_4_ - (float)local_518._4_4_) * fVar281;
      fVar258 = (auVar84._8_4_ - fStack_510) * fVar258;
      fVar266 = (auVar84._12_4_ - fStack_50c) * fVar266;
      local_1c8 = (fVar82 * fVar267 + local_188) * local_178;
      fStack_1c4 = (fVar124 * fVar282 + fStack_184) * fStack_174;
      fStack_1c0 = (fVar126 * fVar288 + fStack_180) * fStack_170;
      fStack_1bc = (fVar129 * fVar289 + fStack_17c) * fStack_16c;
      local_1b8 = (fVar82 * fVar280 + local_188) * local_178;
      fStack_1b4 = (fVar124 * fVar281 + fStack_184) * fStack_174;
      fStack_1b0 = (fVar126 * fVar258 + fStack_180) * fStack_170;
      fStack_1ac = (fVar129 * fVar266 + fStack_17c) * fStack_16c;
      auVar219._0_4_ = (uint)fVar267 & uVar80;
      auVar219._4_4_ = (uint)fVar282 & uVar83;
      auVar219._8_4_ = (uint)fVar288 & uVar125;
      auVar219._12_4_ = (uint)fVar289 & uVar127;
      auVar262._0_8_ = CONCAT44(~uVar83,~uVar80) & 0x7f8000007f800000;
      auVar262._8_4_ = ~uVar125 & 0x7f800000;
      auVar262._12_4_ = ~uVar127 & 0x7f800000;
      auVar262 = auVar262 | auVar219;
      auVar158._0_4_ = (uint)fVar280 & uVar80;
      auVar158._4_4_ = (uint)fVar281 & uVar83;
      auVar158._8_4_ = (uint)fVar258 & uVar125;
      auVar158._12_4_ = (uint)fVar266 & uVar127;
      auVar237._0_8_ = CONCAT44(~uVar83,~uVar80) & 0xff800000ff800000;
      auVar237._8_4_ = ~uVar125 & 0xff800000;
      auVar237._12_4_ = ~uVar127 & 0xff800000;
      auVar237 = auVar237 | auVar158;
      auVar287._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
      auVar287._8_4_ = ABS(fVar154);
      auVar287._12_4_ = ABS(fVar164);
      auVar38._4_4_ = fStack_314;
      auVar38._0_4_ = local_318;
      auVar38._8_4_ = fStack_310;
      auVar38._12_4_ = fStack_30c;
      auVar84 = maxps(auVar38,auVar287);
      fVar280 = auVar84._0_4_ * 1.9073486e-06;
      fVar281 = auVar84._4_4_ * 1.9073486e-06;
      fVar258 = auVar84._8_4_ * 1.9073486e-06;
      fVar266 = auVar84._12_4_ * 1.9073486e-06;
      auVar306._0_4_ = -(uint)(ABS(fVar166) < fVar280 && bVar25);
      auVar306._4_4_ = -(uint)(ABS(fVar183) < fVar281 && bVar26);
      auVar306._8_4_ = -(uint)(ABS(fVar184) < fVar258 && bVar27);
      auVar306._12_4_ = -(uint)(ABS(fVar185) < fVar266 && bVar28);
      iVar64 = movmskps(iVar64,auVar306);
      if (iVar64 != 0) {
        uVar80 = -(uint)(fVar243 <= 0.0);
        uVar83 = -(uint)(fVar256 <= 0.0);
        uVar125 = -(uint)(fVar257 <= 0.0);
        uVar127 = -(uint)(fVar268 <= 0.0);
        auVar227._0_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar306._0_4_;
        auVar227._4_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar306._4_4_;
        auVar227._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar306._8_4_;
        auVar227._12_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar306._12_4_;
        auVar197._0_4_ = ~auVar306._0_4_ & auVar262._0_4_;
        auVar197._4_4_ = ~auVar306._4_4_ & auVar262._4_4_;
        auVar197._8_4_ = ~auVar306._8_4_ & auVar262._8_4_;
        auVar197._12_4_ = ~auVar306._12_4_ & auVar262._12_4_;
        auVar262 = auVar197 | auVar227;
        auVar228._0_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar306._0_4_;
        auVar228._4_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar306._4_4_;
        auVar228._8_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar306._8_4_;
        auVar228._12_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar306._12_4_;
        auVar307._0_4_ = ~auVar306._0_4_ & auVar237._0_4_;
        auVar307._4_4_ = ~auVar306._4_4_ & auVar237._4_4_;
        auVar307._8_4_ = ~auVar306._8_4_ & auVar237._8_4_;
        auVar307._12_4_ = ~auVar306._12_4_ & auVar237._12_4_;
        auVar237 = auVar307 | auVar228;
        auVar174._4_4_ = -(uint)((fVar281 <= ABS(fVar183) || fVar256 <= 0.0) && bVar26);
        auVar174._0_4_ = -(uint)((fVar280 <= ABS(fVar166) || fVar243 <= 0.0) && bVar25);
        auVar174._8_4_ = -(uint)((fVar258 <= ABS(fVar184) || fVar257 <= 0.0) && bVar27);
        auVar174._12_4_ = -(uint)((fVar266 <= ABS(fVar185) || fVar268 <= 0.0) && bVar28);
      }
    }
    auVar175._0_4_ = (auVar174._0_4_ << 0x1f) >> 0x1f;
    auVar175._4_4_ = (auVar174._4_4_ << 0x1f) >> 0x1f;
    auVar175._8_4_ = (auVar174._8_4_ << 0x1f) >> 0x1f;
    auVar175._12_4_ = (auVar174._12_4_ << 0x1f) >> 0x1f;
    auVar175 = auVar175 & local_1a8;
    iVar64 = movmskps(iVar64,auVar175);
    if (iVar64 != 0) {
      local_4a8._4_4_ = fVar199;
      local_4a8._0_4_ = fVar198;
      fStack_4a0 = fVar200;
      fStack_49c = fVar230;
      local_208 = fVar152;
      fStack_204 = fVar153;
      fStack_200 = fVar154;
      fStack_1fc = fVar164;
      local_1f8 = fVar82;
      fStack_1f4 = fVar124;
      fStack_1f0 = fVar126;
      fStack_1ec = fVar129;
      local_328 = fVar166;
      fStack_324 = fVar183;
      fStack_320 = fVar184;
      fStack_31c = fVar185;
      auVar316._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_358._0_4_;
      auVar316._4_4_ = auVar316._0_4_;
      auVar316._8_4_ = auVar316._0_4_;
      auVar316._12_4_ = auVar316._0_4_;
      auVar273 = maxps(auVar316,auVar262);
      auVar276._0_4_ = (ray->super_RayK<1>).tfar - (float)local_358._0_4_;
      auVar276._4_4_ = auVar276._0_4_;
      auVar276._8_4_ = auVar276._0_4_;
      auVar276._12_4_ = auVar276._0_4_;
      auVar156 = minps(auVar276,auVar237);
      auVar105._0_4_ = fVar311 * local_3c8 + local_3e8 * local_548;
      auVar105._4_4_ = local_3f8 * fStack_3c4 + fStack_3e4 * fStack_544;
      auVar105._8_4_ = fStack_3f4 * fStack_3c0 + fStack_3e0 * fStack_540;
      auVar105._12_4_ = fStack_3f0 * fStack_3bc + fStack_3dc * fStack_53c;
      auVar251._0_4_ = (float)local_418._0_4_ * local_308 + auVar105._0_4_;
      auVar251._4_4_ = (float)local_418._4_4_ * fStack_304 + auVar105._4_4_;
      auVar251._8_4_ = fStack_410 * fStack_300 + auVar105._8_4_;
      auVar251._12_4_ = fStack_40c * fStack_2fc + auVar105._12_4_;
      auVar84 = rcpps(auVar105,auVar251);
      fVar243 = auVar84._0_4_;
      fVar256 = auVar84._4_4_;
      fVar257 = auVar84._8_4_;
      fVar268 = auVar84._12_4_;
      fVar243 = ((1.0 - auVar251._0_4_ * fVar243) * fVar243 + fVar243) *
                -(local_428 * (float)local_418._0_4_ +
                 local_448 * fVar311 + (float)local_458._0_4_ * local_3e8);
      fVar256 = ((1.0 - auVar251._4_4_ * fVar256) * fVar256 + fVar256) *
                -(fStack_424 * (float)local_418._4_4_ +
                 fStack_444 * local_3f8 + (float)local_458._4_4_ * fStack_3e4);
      fVar257 = ((1.0 - auVar251._8_4_ * fVar257) * fVar257 + fVar257) *
                -(fStack_420 * fStack_410 + fStack_440 * fStack_3f4 + fStack_450 * fStack_3e0);
      fVar268 = ((1.0 - auVar251._12_4_ * fVar268) * fVar268 + fVar268) *
                -(fStack_41c * fStack_40c + fStack_43c * fStack_3f0 + fStack_44c * fStack_3dc);
      uVar80 = -(uint)(auVar251._0_4_ < 0.0 || ABS(auVar251._0_4_) < 1e-18);
      uVar83 = -(uint)(auVar251._4_4_ < 0.0 || ABS(auVar251._4_4_) < 1e-18);
      uVar125 = -(uint)(auVar251._8_4_ < 0.0 || ABS(auVar251._8_4_) < 1e-18);
      uVar127 = -(uint)(auVar251._12_4_ < 0.0 || ABS(auVar251._12_4_) < 1e-18);
      auVar220._0_8_ = CONCAT44(uVar83,uVar80) & 0xff800000ff800000;
      auVar220._8_4_ = uVar125 & 0xff800000;
      auVar220._12_4_ = uVar127 & 0xff800000;
      auVar106._0_4_ = ~uVar80 & (uint)fVar243;
      auVar106._4_4_ = ~uVar83 & (uint)fVar256;
      auVar106._8_4_ = ~uVar125 & (uint)fVar257;
      auVar106._12_4_ = ~uVar127 & (uint)fVar268;
      auVar273 = maxps(auVar273,auVar106 | auVar220);
      uVar80 = -(uint)(0.0 < auVar251._0_4_ || ABS(auVar251._0_4_) < 1e-18);
      uVar83 = -(uint)(0.0 < auVar251._4_4_ || ABS(auVar251._4_4_) < 1e-18);
      uVar125 = -(uint)(0.0 < auVar251._8_4_ || ABS(auVar251._8_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar251._12_4_ || ABS(auVar251._12_4_) < 1e-18);
      auVar107._0_8_ = CONCAT44(uVar83,uVar80) & 0x7f8000007f800000;
      auVar107._8_4_ = uVar125 & 0x7f800000;
      auVar107._12_4_ = uVar127 & 0x7f800000;
      auVar252._0_4_ = ~uVar80 & (uint)fVar243;
      auVar252._4_4_ = ~uVar83 & (uint)fVar256;
      auVar252._8_4_ = ~uVar125 & (uint)fVar257;
      auVar252._12_4_ = ~uVar127 & (uint)fVar268;
      auVar156 = minps(auVar156,auVar252 | auVar107);
      auVar143._0_4_ = (0.0 - fVar310) * -local_3f8 + (0.0 - fStack_4f4) * -fStack_3e4;
      auVar143._4_4_ = (0.0 - fVar312) * -fStack_3f4 + (0.0 - fStack_4f0) * -fStack_3e0;
      auVar143._8_4_ = (0.0 - fVar313) * -fStack_3f0 + (0.0 - fStack_4ec) * -fStack_3dc;
      auVar143._12_4_ = 0x80000000;
      auVar317._0_4_ =
           -(float)local_418._4_4_ * local_308 + -local_3f8 * local_3c8 + -fStack_3e4 * local_548;
      auVar317._4_4_ =
           -fStack_410 * fStack_304 + -fStack_3f4 * fStack_3c4 + -fStack_3e0 * fStack_544;
      auVar317._8_4_ =
           -fStack_40c * fStack_300 + -fStack_3f0 * fStack_3c0 + -fStack_3dc * fStack_540;
      auVar317._12_4_ = fStack_2fc * -0.0 + fStack_3bc * -0.0 + fStack_53c * -0.0;
      auVar84 = rcpps(auVar143,auVar317);
      fVar243 = auVar84._0_4_;
      fVar256 = auVar84._4_4_;
      fVar257 = auVar84._8_4_;
      fVar268 = auVar84._12_4_;
      fVar243 = ((1.0 - auVar317._0_4_ * fVar243) * fVar243 + fVar243) *
                -((0.0 - fVar299) * -(float)local_418._4_4_ + auVar143._0_4_);
      fVar256 = ((1.0 - auVar317._4_4_ * fVar256) * fVar256 + fVar256) *
                -((0.0 - fVar300) * -fStack_410 + auVar143._4_4_);
      fVar257 = ((1.0 - auVar317._8_4_ * fVar257) * fVar257 + fVar257) *
                -((0.0 - fVar308) * -fStack_40c + auVar143._8_4_);
      fVar268 = ((1.0 - auVar317._12_4_ * fVar268) * fVar268 + fVar268) * 0.0;
      uVar80 = -(uint)(auVar317._0_4_ < 0.0 || ABS(auVar317._0_4_) < 1e-18);
      uVar83 = -(uint)(auVar317._4_4_ < 0.0 || ABS(auVar317._4_4_) < 1e-18);
      uVar125 = -(uint)(auVar317._8_4_ < 0.0 || ABS(auVar317._8_4_) < 1e-18);
      uVar127 = -(uint)(auVar317._12_4_ < 0.0 || ABS(auVar317._12_4_) < 1e-18);
      auVar144._0_8_ = CONCAT44(uVar83,uVar80) & 0xff800000ff800000;
      auVar144._8_4_ = uVar125 & 0xff800000;
      auVar144._12_4_ = uVar127 & 0xff800000;
      auVar108._0_4_ = ~uVar80 & (uint)fVar243;
      auVar108._4_4_ = ~uVar83 & (uint)fVar256;
      auVar108._8_4_ = ~uVar125 & (uint)fVar257;
      auVar108._12_4_ = ~uVar127 & (uint)fVar268;
      _local_478 = maxps(auVar273,auVar108 | auVar144);
      uVar80 = -(uint)(0.0 < auVar317._0_4_ || ABS(auVar317._0_4_) < 1e-18);
      uVar83 = -(uint)(0.0 < auVar317._4_4_ || ABS(auVar317._4_4_) < 1e-18);
      uVar125 = -(uint)(0.0 < auVar317._8_4_ || ABS(auVar317._8_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar317._12_4_ || ABS(auVar317._12_4_) < 1e-18);
      auVar263._0_8_ = CONCAT44(uVar83,uVar80) & 0x7f8000007f800000;
      auVar263._8_4_ = uVar125 & 0x7f800000;
      auVar263._12_4_ = uVar127 & 0x7f800000;
      auVar318._0_4_ = ~uVar80 & (uint)fVar243;
      auVar318._4_4_ = ~uVar83 & (uint)fVar256;
      auVar318._8_4_ = ~uVar125 & (uint)fVar257;
      auVar318._12_4_ = ~uVar127 & (uint)fVar268;
      auVar84 = minps(auVar156,auVar318 | auVar263);
      fVar243 = local_478._0_4_;
      fVar256 = local_478._4_4_;
      fVar257 = local_478._8_4_;
      fVar268 = local_478._12_4_;
      local_538._0_4_ = -(uint)(fVar243 <= auVar84._0_4_) & auVar175._0_4_;
      local_538._4_4_ = -(uint)(fVar256 <= auVar84._4_4_) & auVar175._4_4_;
      local_538._8_4_ = -(uint)(fVar257 <= auVar84._8_4_) & auVar175._8_4_;
      local_538._12_4_ = -(uint)(fVar268 <= auVar84._12_4_) & auVar175._12_4_;
      iVar64 = movmskps(iVar64,local_538);
      if (iVar64 != 0) {
        auVar273 = maxps(ZEXT816(0),local_498);
        auVar40._4_4_ = fStack_1c4;
        auVar40._0_4_ = local_1c8;
        auVar40._8_4_ = fStack_1c0;
        auVar40._12_4_ = fStack_1bc;
        auVar156 = minps(auVar40,_DAT_01f7ba10);
        auVar187._0_12_ = ZEXT812(0);
        auVar187._12_4_ = 0.0;
        auVar235 = maxps(auVar156,auVar187);
        auVar41._4_4_ = fStack_1b4;
        auVar41._0_4_ = local_1b8;
        auVar41._8_4_ = fStack_1b0;
        auVar41._12_4_ = fStack_1ac;
        auVar156 = minps(auVar41,_DAT_01f7ba10);
        auVar156 = maxps(auVar156,auVar187);
        auVar31._4_4_ = local_468;
        auVar31._0_4_ = local_468;
        auVar31._8_4_ = local_468;
        auVar31._12_4_ = local_468;
        local_108[0] = (auVar235._0_4_ + 0.0) * 0.25 * local_468 + local_198;
        local_108[1] = (auVar235._4_4_ + 1.0) * 0.25 * local_468 + local_198;
        local_108[2] = (auVar235._8_4_ + 2.0) * 0.25 * local_468 + local_198;
        local_108[3] = (auVar235._12_4_ + 3.0) * 0.25 * local_468 + local_198;
        local_118[0] = (auVar156._0_4_ + 0.0) * 0.25 * local_468 + local_198;
        local_118[1] = (auVar156._4_4_ + 1.0) * 0.25 * local_468 + local_198;
        local_118[2] = (auVar156._8_4_ + 2.0) * 0.25 * local_468 + local_198;
        local_118[3] = (auVar156._12_4_ + 3.0) * 0.25 * local_468 + local_198;
        auVar159._0_4_ = fVar231 - auVar273._0_4_ * auVar273._0_4_;
        auVar159._4_4_ = fVar232 - auVar273._4_4_ * auVar273._4_4_;
        auVar159._8_4_ = fVar241 - auVar273._8_4_ * auVar273._8_4_;
        auVar159._12_4_ = fVar242 - auVar273._12_4_ * auVar273._12_4_;
        auVar253._0_4_ = (float)local_518._0_4_ * (float)local_518._0_4_ - fVar198 * auVar159._0_4_;
        auVar253._4_4_ = (float)local_518._4_4_ * (float)local_518._4_4_ - fVar199 * auVar159._4_4_;
        auVar253._8_4_ = fStack_510 * fStack_510 - fVar200 * auVar159._8_4_;
        auVar253._12_4_ = fStack_50c * fStack_50c - fVar230 * auVar159._12_4_;
        local_4a8._4_4_ = -(uint)(0.0 <= auVar253._4_4_);
        local_4a8._0_4_ = -(uint)(0.0 <= auVar253._0_4_);
        fStack_4a0 = (float)-(uint)(0.0 <= auVar253._8_4_);
        fStack_49c = (float)-(uint)(0.0 <= auVar253._12_4_);
        iVar64 = movmskps(iVar64,_local_4a8);
        if (iVar64 == 0) {
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar82 = 0.0;
          fVar124 = 0.0;
          fVar126 = 0.0;
          fVar129 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar230 = 0.0;
          _local_588 = ZEXT816(0);
          _local_518 = ZEXT816(0);
          iVar64 = 0;
          auVar239 = _DAT_01f7aa00;
          auVar254 = _DAT_01f7a9f0;
        }
        else {
          auVar273 = sqrtps(auVar31,auVar253);
          auVar145._0_4_ = fVar166 + fVar166;
          auVar145._4_4_ = fVar183 + fVar183;
          auVar145._8_4_ = fVar184 + fVar184;
          auVar145._12_4_ = fVar185 + fVar185;
          auVar156 = rcpps(auVar159,auVar145);
          fVar266 = auVar156._0_4_;
          fVar267 = auVar156._4_4_;
          fVar282 = auVar156._8_4_;
          fVar288 = auVar156._12_4_;
          fVar266 = ((float)DAT_01f7ba10 - auVar145._0_4_ * fVar266) * fVar266 + fVar266;
          fVar267 = (DAT_01f7ba10._4_4_ - auVar145._4_4_ * fVar267) * fVar267 + fVar267;
          fVar282 = (DAT_01f7ba10._8_4_ - auVar145._8_4_ * fVar282) * fVar282 + fVar282;
          fVar288 = (DAT_01f7ba10._12_4_ - auVar145._12_4_ * fVar288) * fVar288 + fVar288;
          fVar289 = (-(float)local_518._0_4_ - auVar273._0_4_) * fVar266;
          fVar290 = (-(float)local_518._4_4_ - auVar273._4_4_) * fVar267;
          fVar297 = (-fStack_510 - auVar273._8_4_) * fVar282;
          fVar314 = (-fStack_50c - auVar273._12_4_) * fVar288;
          fVar266 = (auVar273._0_4_ - (float)local_518._0_4_) * fVar266;
          fVar267 = (auVar273._4_4_ - (float)local_518._4_4_) * fVar267;
          fVar282 = (auVar273._8_4_ - fStack_510) * fVar282;
          fVar288 = (auVar273._12_4_ - fStack_50c) * fVar288;
          fVar231 = (fVar82 * fVar289 + local_188) * local_178;
          fVar232 = (fVar124 * fVar290 + fStack_184) * fStack_174;
          fVar241 = (fVar126 * fVar297 + fStack_180) * fStack_170;
          fVar242 = (fVar129 * fVar314 + fStack_17c) * fStack_16c;
          fVar198 = local_308 * fVar289 - (local_388 * fVar231 + fVar298);
          fVar199 = fStack_304 * fVar290 - (fStack_384 * fVar232 + fVar299);
          fVar200 = fStack_300 * fVar297 - (fStack_380 * fVar241 + fVar300);
          fVar230 = fStack_2fc * fVar314 - (fStack_37c * fVar242 + fVar308);
          local_588._4_4_ = fStack_3c4 * fVar290 - ((float)local_368._4_4_ * fVar232 + fVar310);
          local_588._0_4_ = local_3c8 * fVar289 - ((float)local_368._0_4_ * fVar231 + fVar309);
          fStack_580 = fStack_3c0 * fVar297 - (fStack_360 * fVar241 + fVar312);
          fStack_57c = fStack_3bc * fVar314 - (fStack_35c * fVar242 + fVar313);
          local_518._4_4_ = fStack_544 * fVar290 - (fVar232 * (float)local_378._4_4_ + fStack_4f4);
          local_518._0_4_ = local_548 * fVar289 - (fVar231 * (float)local_378._0_4_ + local_4f8);
          fStack_510 = fStack_540 * fVar297 - (fVar241 * fStack_370 + fStack_4f0);
          fStack_50c = fStack_53c * fVar314 - (fVar242 * fStack_36c + fStack_4ec);
          fVar280 = (fVar82 * fVar266 + local_188) * local_178;
          fVar281 = (fVar124 * fVar267 + fStack_184) * fStack_174;
          fVar311 = (fVar126 * fVar282 + fStack_180) * fStack_170;
          fVar258 = (fVar129 * fVar288 + fStack_17c) * fStack_16c;
          fVar231 = local_308 * fVar266 - (local_388 * fVar280 + fVar298);
          fVar232 = fStack_304 * fVar267 - (fStack_384 * fVar281 + fVar299);
          fVar241 = fStack_300 * fVar282 - (fStack_380 * fVar311 + fVar300);
          fVar242 = fStack_2fc * fVar288 - (fStack_37c * fVar258 + fVar308);
          fVar82 = local_3c8 * fVar266 - ((float)local_368._0_4_ * fVar280 + fVar309);
          fVar124 = fStack_3c4 * fVar267 - ((float)local_368._4_4_ * fVar281 + fVar310);
          fVar126 = fStack_3c0 * fVar282 - (fStack_360 * fVar311 + fVar312);
          fVar129 = fStack_3bc * fVar288 - (fStack_35c * fVar258 + fVar313);
          bVar25 = 0.0 <= auVar253._0_4_;
          uVar80 = -(uint)bVar25;
          bVar26 = 0.0 <= auVar253._4_4_;
          uVar83 = -(uint)bVar26;
          bVar27 = 0.0 <= auVar253._8_4_;
          uVar125 = -(uint)bVar27;
          bVar28 = 0.0 <= auVar253._12_4_;
          uVar127 = -(uint)bVar28;
          auVar187._0_4_ = local_548 * fVar266 - (fVar280 * (float)local_378._0_4_ + local_4f8);
          auVar187._4_4_ = fStack_544 * fVar267 - (fVar281 * (float)local_378._4_4_ + fStack_4f4);
          auVar187._8_4_ = fStack_540 * fVar282 - (fVar311 * fStack_370 + fStack_4f0);
          auVar187._12_4_ = fStack_53c * fVar288 - (fVar258 * fStack_36c + fStack_4ec);
          auVar238._0_4_ = (uint)fVar289 & uVar80;
          auVar238._4_4_ = (uint)fVar290 & uVar83;
          auVar238._8_4_ = (uint)fVar297 & uVar125;
          auVar238._12_4_ = (uint)fVar314 & uVar127;
          auVar254._0_8_ = CONCAT44(~uVar83,~uVar80) & 0x7f8000007f800000;
          auVar254._8_4_ = ~uVar125 & 0x7f800000;
          auVar254._12_4_ = ~uVar127 & 0x7f800000;
          auVar254 = auVar254 | auVar238;
          auVar221._0_4_ = (uint)fVar266 & uVar80;
          auVar221._4_4_ = (uint)fVar267 & uVar83;
          auVar221._8_4_ = (uint)fVar282 & uVar125;
          auVar221._12_4_ = (uint)fVar288 & uVar127;
          auVar239._0_8_ = CONCAT44(~uVar83,~uVar80) & 0xff800000ff800000;
          auVar239._8_4_ = ~uVar125 & 0xff800000;
          auVar239._12_4_ = ~uVar127 & 0xff800000;
          auVar239 = auVar239 | auVar221;
          auVar109._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
          auVar109._8_4_ = ABS(fVar154);
          auVar109._12_4_ = ABS(fVar164);
          auVar39._4_4_ = fStack_314;
          auVar39._0_4_ = local_318;
          auVar39._8_4_ = fStack_310;
          auVar39._12_4_ = fStack_30c;
          auVar156 = maxps(auVar39,auVar109);
          fVar152 = auVar156._0_4_ * 1.9073486e-06;
          fVar153 = auVar156._4_4_ * 1.9073486e-06;
          fVar154 = auVar156._8_4_ * 1.9073486e-06;
          fVar164 = auVar156._12_4_ * 1.9073486e-06;
          auVar222._0_4_ = -(uint)(ABS(fVar166) < fVar152 && bVar25);
          auVar222._4_4_ = -(uint)(ABS(fVar183) < fVar153 && bVar26);
          auVar222._8_4_ = -(uint)(ABS(fVar184) < fVar154 && bVar27);
          auVar222._12_4_ = -(uint)(ABS(fVar185) < fVar164 && bVar28);
          iVar64 = movmskps(iVar64,auVar222);
          if (iVar64 != 0) {
            uVar80 = -(uint)(auVar159._0_4_ <= 0.0);
            uVar83 = -(uint)(auVar159._4_4_ <= 0.0);
            uVar125 = -(uint)(auVar159._8_4_ <= 0.0);
            uVar127 = -(uint)(auVar159._12_4_ <= 0.0);
            auVar278._0_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar222._0_4_;
            auVar278._4_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar222._4_4_;
            auVar278._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar222._8_4_;
            auVar278._12_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar222._12_4_;
            auVar265._0_4_ = ~auVar222._0_4_ & auVar254._0_4_;
            auVar265._4_4_ = ~auVar222._4_4_ & auVar254._4_4_;
            auVar265._8_4_ = ~auVar222._8_4_ & auVar254._8_4_;
            auVar265._12_4_ = ~auVar222._12_4_ & auVar254._12_4_;
            auVar254 = auVar265 | auVar278;
            auVar279._0_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar222._0_4_;
            auVar279._4_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar222._4_4_;
            auVar279._8_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar222._8_4_;
            auVar279._12_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar222._12_4_;
            auVar229._0_4_ = ~auVar222._0_4_ & auVar239._0_4_;
            auVar229._4_4_ = ~auVar222._4_4_ & auVar239._4_4_;
            auVar229._8_4_ = ~auVar222._8_4_ & auVar239._8_4_;
            auVar229._12_4_ = ~auVar222._12_4_ & auVar239._12_4_;
            auVar239 = auVar229 | auVar279;
            local_4a8._4_4_ = -(uint)((fVar153 <= ABS(fVar183) || auVar159._4_4_ <= 0.0) && bVar26);
            local_4a8._0_4_ = -(uint)((fVar152 <= ABS(fVar166) || auVar159._0_4_ <= 0.0) && bVar25);
            fStack_4a0 = (float)-(uint)((fVar154 <= ABS(fVar184) || auVar159._8_4_ <= 0.0) && bVar27
                                       );
            fStack_49c = (float)-(uint)((fVar164 <= ABS(fVar185) || auVar159._12_4_ <= 0.0) &&
                                       bVar28);
          }
        }
        fVar152 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar153 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar154 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_498._4_4_ =
             -(uint)(0.3 <= ABS(fVar232 * fVar152 + fVar124 * fVar153 + auVar187._4_4_ * fVar154));
        local_498._0_4_ =
             -(uint)(0.3 <= ABS(fVar231 * fVar152 + fVar82 * fVar153 + auVar187._0_4_ * fVar154));
        local_498._8_4_ =
             -(uint)(0.3 <= ABS(fVar241 * fVar152 + fVar126 * fVar153 + auVar187._8_4_ * fVar154));
        local_498._12_4_ =
             -(uint)(0.3 <= ABS(fVar242 * fVar152 + fVar129 * fVar153 + auVar187._12_4_ * fVar154));
        _local_138 = _local_478;
        local_128 = minps(auVar84,auVar254);
        _local_238 = maxps(_local_478,auVar239);
        local_228 = auVar84;
        auVar240._0_4_ = -(uint)(fVar243 <= local_128._0_4_) & local_538._0_4_;
        auVar240._4_4_ = -(uint)(fVar256 <= local_128._4_4_) & local_538._4_4_;
        auVar240._8_4_ = -(uint)(fVar257 <= local_128._8_4_) & local_538._8_4_;
        auVar240._12_4_ = -(uint)(fVar268 <= local_128._12_4_) & local_538._12_4_;
        fVar82 = local_238._0_4_;
        fVar124 = local_238._4_4_;
        fVar126 = local_238._8_4_;
        fVar129 = local_238._12_4_;
        auVar255._0_8_ =
             CONCAT44(-(uint)(fVar124 <= auVar84._4_4_) & local_538._4_4_,
                      -(uint)(fVar82 <= auVar84._0_4_) & local_538._0_4_);
        auVar255._8_4_ = -(uint)(fVar126 <= auVar84._8_4_) & local_538._8_4_;
        auVar255._12_4_ = -(uint)(fVar129 <= auVar84._12_4_) & local_538._12_4_;
        auVar112._8_4_ = auVar255._8_4_;
        auVar112._0_8_ = auVar255._0_8_;
        auVar112._12_4_ = auVar255._12_4_;
        iVar64 = movmskps(iVar64,auVar112 | auVar240);
        auVar104 = local_538;
        if (iVar64 != 0) {
          _local_378 = auVar255;
          local_388 = fVar165;
          fStack_384 = fVar165;
          fStack_380 = fVar165;
          fStack_37c = fVar165;
          local_518._0_4_ =
               -(uint)((int)fVar165 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_518._0_4_ * fVar154 +
                                                 (float)local_588._0_4_ * fVar153 +
                                                 fVar198 * fVar152)) & local_4a8._0_4_) << 0x1f) >>
                      0x1f) + 4);
          local_518._4_4_ =
               -(uint)((int)fVar165 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_518._4_4_ * fVar154 +
                                                 (float)local_588._4_4_ * fVar153 +
                                                 fVar199 * fVar152)) & local_4a8._4_4_) << 0x1f) >>
                      0x1f) + 4);
          fStack_510 = (float)-(uint)((int)fVar165 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_510 * fVar154 +
                                                                fStack_580 * fVar153 +
                                                                fVar200 * fVar152)) &
                                            (uint)fStack_4a0) << 0x1f) >> 0x1f) + 4);
          fStack_50c = (float)-(uint)((int)fVar165 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_50c * fVar154 +
                                                                fStack_57c * fVar153 +
                                                                fVar230 * fVar152)) &
                                            (uint)fStack_49c) << 0x1f) >> 0x1f) + 4);
          local_348 = ~_local_518 & auVar240;
          iVar64 = movmskps(iVar64,local_348);
          _local_368 = auVar240;
          if (iVar64 == 0) {
            fVar152 = (ray->super_RayK<1>).tfar;
            fVar153 = fVar82;
            fVar154 = fVar124;
            fVar164 = fVar126;
            fVar166 = fVar129;
          }
          else {
            local_488 = local_508 + fVar243;
            fStack_484 = fStack_504 + fVar256;
            fStack_480 = fStack_500 + fVar257;
            fStack_47c = fStack_4fc + fVar268;
            do {
              auVar156 = ~local_348 & _DAT_01f7a9f0 | local_348 & _local_478;
              auVar177._4_4_ = auVar156._0_4_;
              auVar177._0_4_ = auVar156._4_4_;
              auVar177._8_4_ = auVar156._12_4_;
              auVar177._12_4_ = auVar156._8_4_;
              auVar84 = minps(auVar177,auVar156);
              auVar113._0_8_ = auVar84._8_8_;
              auVar113._8_4_ = auVar84._0_4_;
              auVar113._12_4_ = auVar84._4_4_;
              auVar84 = minps(auVar113,auVar84);
              auVar114._0_8_ =
                   CONCAT44(-(uint)(auVar84._4_4_ == auVar156._4_4_) & local_348._4_4_,
                            -(uint)(auVar84._0_4_ == auVar156._0_4_) & local_348._0_4_);
              auVar114._8_4_ = -(uint)(auVar84._8_4_ == auVar156._8_4_) & local_348._8_4_;
              auVar114._12_4_ = -(uint)(auVar84._12_4_ == auVar156._12_4_) & local_348._12_4_;
              iVar64 = movmskps(iVar64,auVar114);
              auVar147 = local_348;
              if (iVar64 != 0) {
                auVar147._8_4_ = auVar114._8_4_;
                auVar147._0_8_ = auVar114._0_8_;
                auVar147._12_4_ = auVar114._12_4_;
              }
              uVar65 = movmskps(iVar64,auVar147);
              pRVar68 = (RayHit *)0x0;
              if (CONCAT44(uVar69,uVar65) != 0) {
                for (; (CONCAT44(uVar69,uVar65) >> (long)pRVar68 & 1) == 0;
                    pRVar68 = (RayHit *)((long)(pRVar68->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_348 + (long)pRVar68 * 4) = 0;
              fVar152 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar153 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar154 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar164 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar36._4_4_ = fStack_394;
              auVar36._0_4_ = local_398;
              auVar36._8_4_ = fStack_390;
              auVar36._12_4_ = fStack_38c;
              auVar34._4_4_ = fStack_3a4;
              auVar34._0_4_ = local_3a8;
              auVar34._8_4_ = fStack_3a0;
              auVar34._12_4_ = fStack_39c;
              auVar156 = minps(auVar36,auVar34);
              auVar273 = maxps(auVar36,auVar34);
              auVar32._4_4_ = fStack_3b4;
              auVar32._0_4_ = local_3b8;
              auVar32._8_4_ = fStack_3b0;
              auVar32._12_4_ = fStack_3ac;
              auVar29._4_4_ = fStack_4e4;
              auVar29._0_4_ = local_4e8;
              auVar29._8_4_ = fStack_4e0;
              auVar29._12_4_ = fStack_4dc;
              auVar84 = minps(auVar32,auVar29);
              auVar156 = minps(auVar156,auVar84);
              auVar84 = maxps(auVar32,auVar29);
              auVar84 = maxps(auVar273,auVar84);
              auVar188._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar188._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar188._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_468 = auVar84._12_4_;
              auVar115._0_8_ = auVar84._0_8_ & 0x7fffffff7fffffff;
              auVar115._8_4_ = auVar84._8_4_ & 0x7fffffff;
              auVar115._12_4_ = ABS(local_468);
              auVar84 = maxps(auVar188,auVar115);
              fVar166 = auVar84._4_4_;
              if (auVar84._4_4_ <= auVar84._0_4_) {
                fVar166 = auVar84._0_4_;
              }
              auVar189._8_8_ = auVar84._8_8_;
              auVar189._0_8_ = auVar84._8_8_;
              if (auVar84._8_4_ <= fVar166) {
                auVar189._0_4_ = fVar166;
              }
              register0x00001304 = auVar189._4_12_;
              local_408._0_4_ = auVar189._0_4_ * 1.9073486e-06;
              local_3f8 = SQRT(fVar154 * fVar154 + fVar153 * fVar153 + fVar152 * fVar152) *
                          1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              fVar166 = local_108[(long)pRVar68];
              fVar183 = *(float *)(local_138 + (long)pRVar68 * 4);
              fVar184 = 0.0;
              fVar185 = 0.0;
              lVar76 = 5;
              do {
                fVar200 = 1.0 - fVar166;
                fVar198 = fVar200 * fVar200 * fVar200;
                fVar241 = fVar166 * fVar166 * fVar166;
                fVar231 = fVar166 * fVar200;
                fVar199 = fVar198 * 0.16666667;
                fVar242 = (fVar200 * fVar231 * 12.0 + fVar166 * fVar231 * 6.0 +
                          fVar198 * 4.0 + fVar241) * 0.16666667;
                fVar243 = (fVar166 * fVar231 * 12.0 + fVar200 * fVar231 * 6.0 +
                          fVar241 * 4.0 + fVar198) * 0.16666667;
                fVar241 = fVar241 * 0.16666667;
                fVar230 = fVar199 * fStack_38c +
                          fVar242 * fStack_39c + fVar243 * fStack_3ac + fVar241 * fStack_4dc;
                fVar256 = -fVar200 * fVar200 * 0.5;
                fVar232 = (-fVar166 * fVar166 - fVar231 * 4.0) * 0.5;
                fVar231 = (fVar231 * 4.0 + fVar200 * fVar200) * 0.5;
                fVar198 = fVar166 * fVar166 * 0.5;
                fVar281 = fVar256 * local_398 +
                          fVar232 * local_3a8 + fVar231 * local_3b8 + fVar198 * local_4e8;
                fVar311 = fVar256 * fStack_394 +
                          fVar232 * fStack_3a4 + fVar231 * fStack_3b4 + fVar198 * fStack_4e4;
                fVar258 = fVar256 * fStack_390 +
                          fVar232 * fStack_3a0 + fVar231 * fStack_3b0 + fVar198 * fStack_4e0;
                fVar266 = fVar256 * fStack_38c +
                          fVar232 * fStack_39c + fVar231 * fStack_3ac + fVar198 * fStack_4dc;
                fVar198 = fVar166 - (fVar200 + fVar200);
                fVar231 = fVar200 - (fVar166 + fVar166);
                fVar257 = fVar200 * local_398 +
                          fVar198 * local_3a8 + fVar231 * local_3b8 + local_4e8 * fVar166;
                fVar268 = fVar200 * fStack_394 +
                          fVar198 * fStack_3a4 + fVar231 * fStack_3b4 + fStack_4e4 * fVar166;
                fVar280 = fVar200 * fStack_390 +
                          fVar198 * fStack_3a0 + fVar231 * fStack_3b0 + fStack_4e0 * fVar166;
                fVar231 = (fVar183 * fVar152 + 0.0) -
                          (fVar199 * local_398 +
                          fVar242 * local_3a8 + fVar243 * local_3b8 + fVar241 * local_4e8);
                fVar232 = (fVar183 * fVar153 + 0.0) -
                          (fVar199 * fStack_394 +
                          fVar242 * fStack_3a4 + fVar243 * fStack_3b4 + fVar241 * fStack_4e4);
                fVar241 = (fVar183 * fVar154 + 0.0) -
                          (fVar199 * fStack_390 +
                          fVar242 * fStack_3a0 + fVar243 * fStack_3b0 + fVar241 * fStack_4e0);
                fVar199 = (fVar183 * fVar164 + 0.0) - fVar230;
                fVar198 = fVar232 * fVar232;
                fVar242 = fVar241 * fVar241;
                fVar243 = fVar199 * fVar199;
                fVar200 = fVar198 + fVar231 * fVar231 + fVar242;
                fVar256 = fVar198 + fVar198 + fVar243;
                auVar277._4_4_ = fVar256;
                auVar277._0_4_ = fVar200;
                fVar242 = fVar198 + fVar242 + fVar242;
                fVar243 = fVar198 + fVar243 + fVar243;
                fVar198 = (float)local_408._0_4_;
                if ((float)local_408._0_4_ <= local_3f8 * fVar183) {
                  fVar198 = local_3f8 * fVar183;
                }
                fVar288 = fVar311 * fVar311 + fVar281 * fVar281 + fVar258 * fVar258;
                auVar84 = ZEXT416((uint)fVar288);
                auVar156 = rsqrtss(ZEXT416((uint)fVar288),auVar84);
                fVar267 = auVar156._0_4_;
                fVar289 = fVar267 * 1.5 - fVar267 * fVar267 * fVar288 * 0.5 * fVar267;
                fVar298 = fVar281 * fVar289;
                fVar299 = fVar311 * fVar289;
                fVar300 = fVar258 * fVar289;
                fVar308 = fVar266 * fVar289;
                fVar297 = fVar280 * fVar258 + fVar268 * fVar311 + fVar257 * fVar281;
                auVar84 = rcpss(auVar84,auVar84);
                fVar282 = (2.0 - fVar288 * auVar84._0_4_) * auVar84._0_4_;
                fVar267 = fVar232 * fVar299;
                fStack_3e0 = fVar241 * fVar300;
                fStack_3dc = fVar199 * fVar308;
                fVar290 = fVar267 + fVar231 * fVar298 + fStack_3e0;
                fStack_3e4 = fVar267 + fVar267 + fStack_3dc;
                fStack_3e0 = fVar267 + fStack_3e0 + fStack_3e0;
                fStack_3dc = fVar267 + fStack_3dc + fStack_3dc;
                local_538._0_4_ =
                     (SQRT(fVar200) + 1.0) * ((float)local_408._0_4_ / SQRT(fVar288)) +
                     SQRT(fVar200) * (float)local_408._0_4_ + fVar198;
                fVar267 = fVar164 * fVar308;
                fVar308 = fVar308 * -fVar266;
                fVar268 = fVar300 * -fVar258 + fVar299 * -fVar311 + fVar298 * -fVar281 +
                          fVar282 * (fVar288 * fVar280 - fVar297 * fVar258) * fVar289 * fVar241 +
                          fVar282 * (fVar288 * fVar268 - fVar297 * fVar311) * fVar289 * fVar232 +
                          fVar282 * (fVar288 * fVar257 - fVar297 * fVar281) * fVar289 * fVar231;
                fVar257 = fVar154 * fVar300 + fVar153 * fVar299 + fVar152 * fVar298;
                auVar277._8_4_ = fVar242;
                auVar277._12_4_ = fVar243;
                fVar200 = fVar200 - fVar290 * fVar290;
                auVar264._0_8_ = CONCAT44(fVar256 - fStack_3e4 * fStack_3e4,fVar200);
                auVar264._8_4_ = fVar242 - fStack_3e0 * fStack_3e0;
                auVar264._12_4_ = fVar243 - fStack_3dc * fStack_3dc;
                fVar256 = -fVar266 * fVar199;
                fVar199 = fVar164 * fVar199;
                local_3e8 = fVar290;
                fVar242 = (fVar154 * fVar241 + fVar153 * fVar232 + fVar152 * fVar231) -
                          fVar290 * fVar257;
                auVar148._8_4_ = auVar264._8_4_;
                auVar148._0_8_ = auVar264._0_8_;
                auVar148._12_4_ = auVar264._12_4_;
                auVar84 = rsqrtss(auVar148,auVar264);
                fVar243 = auVar84._0_4_;
                auVar178._0_4_ = fVar243 * 1.5 - fVar243 * fVar243 * fVar200 * 0.5 * fVar243;
                auVar178._4_12_ = auVar84._4_12_;
                local_4f8 = fVar183;
                fStack_4f4 = fVar166;
                fStack_4f0 = fVar184;
                fStack_4ec = fVar185;
                if (fVar200 < 0.0) {
                  fStack_424 = (float)local_408._4_4_;
                  fStack_420 = fStack_400;
                  fStack_41c = fStack_3fc;
                  _local_458 = auVar178;
                  local_448 = fVar242;
                  fStack_444 = fVar199;
                  fStack_440 = fVar154 * fVar241;
                  fStack_43c = fVar199;
                  local_438 = fVar257;
                  fStack_434 = fVar267;
                  fStack_430 = fVar154 * fVar300;
                  fStack_42c = fVar267;
                  local_428 = fVar198;
                  _local_418 = auVar277;
                  fVar200 = sqrtf(fVar200);
                  pRVar68 = extraout_RAX;
                  auVar178 = _local_458;
                  auVar277 = _local_418;
                  fVar198 = local_428;
                  fVar242 = local_448;
                  fVar199 = fStack_444;
                  fVar257 = local_438;
                  fVar267 = fStack_434;
                }
                else {
                  fVar200 = SQRT(fVar200);
                }
                fVar200 = fVar200 - fVar230;
                fVar166 = ((-fVar258 * fVar241 + -fVar311 * fVar232 + -fVar281 * fVar231) -
                          fVar290 * fVar268) * auVar178._0_4_ - fVar266;
                fVar242 = fVar242 * auVar178._0_4_;
                auVar224._4_4_ = fVar308;
                auVar224._0_4_ = fVar268;
                auVar179._0_4_ = fVar268 * fVar242 - fVar257 * fVar166;
                auVar191._8_4_ = -fVar256;
                auVar191._0_8_ = CONCAT44(fVar256,fVar166) ^ 0x8000000000000000;
                auVar191._12_4_ = fVar199;
                auVar190._8_8_ = auVar191._8_8_;
                auVar190._0_8_ = CONCAT44(fVar242,fVar166) ^ 0x80000000;
                auVar179._4_4_ = auVar179._0_4_;
                auVar179._8_4_ = auVar179._0_4_;
                auVar179._12_4_ = auVar179._0_4_;
                auVar84 = divps(auVar190,auVar179);
                auVar224._8_4_ = fVar308;
                auVar224._12_4_ = -fVar267;
                auVar223._8_8_ = auVar224._8_8_;
                auVar223._0_8_ = CONCAT44(fVar257,fVar268) ^ 0x8000000000000000;
                auVar156 = divps(auVar223,auVar179);
                fVar183 = local_4f8 - (fVar200 * auVar156._0_4_ + local_3e8 * auVar84._0_4_);
                fVar166 = fStack_4f4 - (fVar200 * auVar156._4_4_ + local_3e8 * auVar84._4_4_);
                fVar184 = fStack_4f0 - (fVar200 * auVar156._8_4_ + local_3e8 * auVar84._8_4_);
                fVar185 = fStack_4ec - (fVar200 * auVar156._12_4_ + local_3e8 * auVar84._12_4_);
                if ((ABS(local_3e8) < (float)local_538._0_4_) &&
                   (ABS(fVar200) < local_468 * 1.9073486e-06 + fVar198 + (float)local_538._0_4_)) {
                  fVar183 = local_358._0_4_ + fVar183;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar183) &&
                     (((fVar152 = (ray->super_RayK<1>).tfar, fVar183 <= fVar152 && (0.0 <= fVar166))
                      && (fVar166 <= 1.0)))) {
                    auVar84 = rsqrtss(auVar277,auVar277);
                    fVar153 = auVar84._0_4_;
                    pGVar21 = (context->scene->geometries).items[(long)pRVar71].ptr;
                    uVar80 = (ray->super_RayK<1>).mask;
                    pRVar68 = (RayHit *)(ulong)uVar80;
                    pRVar70 = pRVar71;
                    if ((pGVar21->mask & uVar80) != 0) {
                      fVar153 = fVar153 * 1.5 + fVar153 * fVar153 * auVar277._0_4_ * -0.5 * fVar153;
                      fVar231 = fVar231 * fVar153;
                      fVar232 = fVar232 * fVar153;
                      fVar241 = fVar241 * fVar153;
                      fVar153 = fVar266 * fVar231 + fVar281;
                      fVar154 = fVar266 * fVar232 + fVar311;
                      fVar164 = fVar266 * fVar241 + fVar258;
                      fVar185 = fVar232 * fVar281 - fVar311 * fVar231;
                      fVar198 = fVar241 * fVar311 - fVar258 * fVar232;
                      fVar199 = fVar231 * fVar258 - fVar281 * fVar241;
                      fVar184 = fVar154 * fVar198 - fVar199 * fVar153;
                      fVar154 = fVar164 * fVar199 - fVar185 * fVar154;
                      fVar153 = fVar153 * fVar185 - fVar198 * fVar164;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar183;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar153,fVar154);
                        (ray->Ng).field_0.field_0.z = fVar184;
                        ray->u = fVar166;
                        ray->v = 0.0;
                        ray->primID = uVar79;
                        ray->geomID = uVar78;
                        ray->instID[0] = context->user->instID[0];
                        uVar80 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar80;
                        pRVar68 = (RayHit *)(ulong)uVar80;
                      }
                      else {
                        local_4d8 = CONCAT44(fVar153,fVar154);
                        fStack_4d0 = fVar184;
                        fStack_4cc = fVar166;
                        local_4c8 = 0;
                        local_4c4 = uVar79;
                        local_4c0 = uVar78;
                        local_4bc = context->user->instID[0];
                        pRVar70 = (RTCIntersectArguments *)(ulong)local_4bc;
                        local_4b8 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar183;
                        local_3d8._0_4_ = 0xffffffff;
                        local_578.geometryUserPtr = pGVar21->userPtr;
                        local_578.valid = (int *)local_3d8;
                        local_578.context = context->user;
                        local_578.hit = (RTCHitN *)&local_4d8;
                        local_578.N = 1;
                        local_578.ray = (RTCRayN *)ray;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00af90fd:
                          pRVar70 = context->args;
                          if ((pRVar70->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar70->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar70->filter)(&local_578);
                            if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00af9194;
                          }
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_578.hit;
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_578.hit + 4);
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_578.hit + 8);
                          *(float *)((long)local_578.ray + 0x3c) = *(float *)(local_578.hit + 0xc);
                          *(float *)((long)local_578.ray + 0x40) = *(float *)(local_578.hit + 0x10);
                          *(float *)((long)local_578.ray + 0x44) = *(float *)(local_578.hit + 0x14);
                          *(float *)((long)local_578.ray + 0x48) = *(float *)(local_578.hit + 0x18);
                          *(float *)((long)local_578.ray + 0x4c) = *(float *)(local_578.hit + 0x1c);
                          pRVar70 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_578.hit + 0x20);
                          *(float *)((long)local_578.ray + 0x50) = *(float *)(local_578.hit + 0x20);
                          pRVar68 = (RayHit *)local_578.ray;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_578);
                          if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00af90fd;
LAB_00af9194:
                          (ray->super_RayK<1>).tfar = fVar152;
                          pRVar68 = (RayHit *)local_578.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              fVar152 = (ray->super_RayK<1>).tfar;
              local_348._0_4_ = -(uint)(local_488 <= fVar152) & local_348._0_4_;
              local_348._4_4_ = -(uint)(fStack_484 <= fVar152) & local_348._4_4_;
              local_348._8_4_ = -(uint)(fStack_480 <= fVar152) & local_348._8_4_;
              local_348._12_4_ = -(uint)(fStack_47c <= fVar152) & local_348._12_4_;
              uVar69 = (undefined4)((ulong)pRVar68 >> 0x20);
              iVar64 = movmskps((int)pRVar68,local_348);
            } while (iVar64 != 0);
            fVar153 = (float)local_238._0_4_;
            fVar154 = (float)local_238._4_4_;
            fVar164 = fStack_230;
            fVar166 = fStack_22c;
          }
          uVar65 = SUB84(pRVar70,0);
          auVar162._0_4_ = -(uint)(fVar82 + local_508 <= fVar152) & local_378._0_4_;
          auVar162._4_4_ = -(uint)(fVar124 + fStack_504 <= fVar152) & local_378._4_4_;
          auVar162._8_4_ = -(uint)(fVar126 + fStack_500 <= fVar152) & (uint)fStack_370;
          auVar162._12_4_ = -(uint)(fVar129 + fStack_4fc <= fVar152) & (uint)fStack_36c;
          local_498._0_4_ =
               -(uint)((int)local_388 <
                      ((int)((local_498._0_4_ & local_4a8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)fStack_384 <
                      ((int)((local_498._4_4_ & local_4a8._4_4_) << 0x1f) >> 0x1f) + 4);
          local_498._8_4_ =
               -(uint)((int)fStack_380 <
                      ((int)((local_498._8_4_ & (uint)fStack_4a0) << 0x1f) >> 0x1f) + 4);
          local_498._12_4_ =
               -(uint)((int)fStack_37c <
                      ((int)((local_498._12_4_ & (uint)fStack_49c) << 0x1f) >> 0x1f) + 4);
          local_3d8 = ~local_498 & auVar162;
          iVar64 = movmskps(0,local_3d8);
          if (iVar64 != 0) {
            local_488 = local_508 + fVar153;
            fStack_484 = fStack_504 + fVar154;
            fStack_480 = fStack_500 + fVar164;
            fStack_47c = fStack_4fc + fVar166;
            local_478._4_4_ = fVar154;
            local_478._0_4_ = fVar153;
            fStack_470 = fVar164;
            fStack_46c = fVar166;
            do {
              uVar80 = local_3d8._0_4_;
              uVar83 = local_3d8._4_4_;
              uVar125 = local_3d8._8_4_;
              uVar127 = local_3d8._12_4_;
              auVar116._0_4_ = uVar80 & (uint)fVar153;
              auVar116._4_4_ = uVar83 & (uint)fVar154;
              auVar116._8_4_ = uVar125 & (uint)fVar164;
              auVar116._12_4_ = uVar127 & (uint)fVar166;
              auVar163._0_8_ = CONCAT44(~uVar83,~uVar80) & 0x7f8000007f800000;
              auVar163._8_4_ = ~uVar125 & 0x7f800000;
              auVar163._12_4_ = ~uVar127 & 0x7f800000;
              auVar163 = auVar163 | auVar116;
              auVar180._4_4_ = auVar163._0_4_;
              auVar180._0_4_ = auVar163._4_4_;
              auVar180._8_4_ = auVar163._12_4_;
              auVar180._12_4_ = auVar163._8_4_;
              auVar84 = minps(auVar180,auVar163);
              auVar117._0_8_ = auVar84._8_8_;
              auVar117._8_4_ = auVar84._0_4_;
              auVar117._12_4_ = auVar84._4_4_;
              auVar84 = minps(auVar117,auVar84);
              auVar118._0_8_ =
                   CONCAT44(-(uint)(auVar84._4_4_ == auVar163._4_4_) & uVar83,
                            -(uint)(auVar84._0_4_ == auVar163._0_4_) & uVar80);
              auVar118._8_4_ = -(uint)(auVar84._8_4_ == auVar163._8_4_) & uVar125;
              auVar118._12_4_ = -(uint)(auVar84._12_4_ == auVar163._12_4_) & uVar127;
              iVar64 = movmskps(iVar64,auVar118);
              auVar149 = local_3d8;
              if (iVar64 != 0) {
                auVar149._8_4_ = auVar118._8_4_;
                auVar149._0_8_ = auVar118._0_8_;
                auVar149._12_4_ = auVar118._12_4_;
              }
              uVar65 = movmskps(iVar64,auVar149);
              pRVar68 = (RayHit *)0x0;
              if (CONCAT44(uVar69,uVar65) != 0) {
                for (; (CONCAT44(uVar69,uVar65) >> (long)pRVar68 & 1) == 0;
                    pRVar68 = (RayHit *)((long)(pRVar68->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_3d8 + (long)pRVar68 * 4) = 0;
              fVar82 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar126 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar129 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar37._4_4_ = fStack_394;
              auVar37._0_4_ = local_398;
              auVar37._8_4_ = fStack_390;
              auVar37._12_4_ = fStack_38c;
              auVar35._4_4_ = fStack_3a4;
              auVar35._0_4_ = local_3a8;
              auVar35._8_4_ = fStack_3a0;
              auVar35._12_4_ = fStack_39c;
              auVar156 = minps(auVar37,auVar35);
              auVar273 = maxps(auVar37,auVar35);
              auVar33._4_4_ = fStack_3b4;
              auVar33._0_4_ = local_3b8;
              auVar33._8_4_ = fStack_3b0;
              auVar33._12_4_ = fStack_3ac;
              auVar30._4_4_ = fStack_4e4;
              auVar30._0_4_ = local_4e8;
              auVar30._8_4_ = fStack_4e0;
              auVar30._12_4_ = fStack_4dc;
              auVar84 = minps(auVar33,auVar30);
              auVar156 = minps(auVar156,auVar84);
              auVar84 = maxps(auVar33,auVar30);
              auVar84 = maxps(auVar273,auVar84);
              auVar192._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar192._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar192._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_468 = auVar84._12_4_;
              auVar119._0_8_ = auVar84._0_8_ & 0x7fffffff7fffffff;
              auVar119._8_4_ = auVar84._8_4_ & 0x7fffffff;
              auVar119._12_4_ = ABS(local_468);
              auVar84 = maxps(auVar192,auVar119);
              fVar152 = auVar84._4_4_;
              if (auVar84._4_4_ <= auVar84._0_4_) {
                fVar152 = auVar84._0_4_;
              }
              auVar193._8_8_ = auVar84._8_8_;
              auVar193._0_8_ = auVar84._8_8_;
              if (auVar84._8_4_ <= fVar152) {
                auVar193._0_4_ = fVar152;
              }
              register0x00001304 = auVar193._4_12_;
              local_408._0_4_ = auVar193._0_4_ * 1.9073486e-06;
              local_3f8 = SQRT(fVar126 * fVar126 + fVar124 * fVar124 + fVar82 * fVar82) *
                          1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              fVar152 = local_118[(long)pRVar68];
              fVar153 = *(float *)(local_228 + (long)pRVar68 * 4);
              fVar154 = 0.0;
              fVar164 = 0.0;
              lVar76 = 5;
              do {
                fVar256 = 1.0 - fVar152;
                fVar166 = fVar256 * fVar256 * fVar256;
                fVar198 = fVar152 * fVar152 * fVar152;
                fVar185 = fVar152 * fVar256;
                fVar183 = fVar166 * 0.16666667;
                fVar230 = (fVar256 * fVar185 * 12.0 + fVar152 * fVar185 * 6.0 +
                          fVar166 * 4.0 + fVar198) * 0.16666667;
                fVar231 = (fVar152 * fVar185 * 12.0 + fVar256 * fVar185 * 6.0 +
                          fVar198 * 4.0 + fVar166) * 0.16666667;
                fVar198 = fVar198 * 0.16666667;
                fVar184 = fVar183 * fStack_38c +
                          fVar230 * fStack_39c + fVar231 * fStack_3ac + fVar198 * fStack_4dc;
                fVar200 = -fVar256 * fVar256 * 0.5;
                fVar199 = (-fVar152 * fVar152 - fVar185 * 4.0) * 0.5;
                fVar185 = (fVar185 * 4.0 + fVar256 * fVar256) * 0.5;
                fVar166 = fVar152 * fVar152 * 0.5;
                fVar232 = fVar200 * local_398 +
                          fVar199 * local_3a8 + fVar185 * local_3b8 + fVar166 * local_4e8;
                fVar241 = fVar200 * fStack_394 +
                          fVar199 * fStack_3a4 + fVar185 * fStack_3b4 + fVar166 * fStack_4e4;
                fVar242 = fVar200 * fStack_390 +
                          fVar199 * fStack_3a0 + fVar185 * fStack_3b0 + fVar166 * fStack_4e0;
                fVar243 = fVar200 * fStack_38c +
                          fVar199 * fStack_39c + fVar185 * fStack_3ac + fVar166 * fStack_4dc;
                fVar166 = fVar152 - (fVar256 + fVar256);
                fVar185 = fVar256 - (fVar152 + fVar152);
                fVar257 = fVar256 * local_398 +
                          fVar166 * local_3a8 + fVar185 * local_3b8 + local_4e8 * fVar152;
                fVar268 = fVar256 * fStack_394 +
                          fVar166 * fStack_3a4 + fVar185 * fStack_3b4 + fStack_4e4 * fVar152;
                fVar256 = fVar256 * fStack_390 +
                          fVar166 * fStack_3a0 + fVar185 * fStack_3b0 + fStack_4e0 * fVar152;
                fVar199 = (fVar153 * fVar82 + 0.0) -
                          (fVar183 * local_398 +
                          fVar230 * local_3a8 + fVar231 * local_3b8 + fVar198 * local_4e8);
                fVar200 = (fVar153 * fVar124 + 0.0) -
                          (fVar183 * fStack_394 +
                          fVar230 * fStack_3a4 + fVar231 * fStack_3b4 + fVar198 * fStack_4e4);
                fVar230 = (fVar153 * fVar126 + 0.0) -
                          (fVar183 * fStack_390 +
                          fVar230 * fStack_3a0 + fVar231 * fStack_3b0 + fVar198 * fStack_4e0);
                fVar166 = (fVar153 * fVar129 + 0.0) - fVar184;
                fVar183 = fVar200 * fVar200;
                fVar185 = fVar230 * fVar230;
                fVar198 = fVar166 * fVar166;
                auVar296._0_4_ = fVar183 + fVar199 * fVar199 + fVar185;
                auVar296._4_4_ = fVar183 + fVar183 + fVar198;
                auVar296._8_4_ = fVar183 + fVar185 + fVar185;
                auVar296._12_4_ = fVar183 + fVar198 + fVar198;
                local_3e8 = (float)local_408._0_4_;
                if ((float)local_408._0_4_ <= local_3f8 * fVar153) {
                  local_3e8 = local_3f8 * fVar153;
                }
                fVar198 = fVar241 * fVar241 + fVar232 * fVar232 + fVar242 * fVar242;
                auVar84 = ZEXT416((uint)fVar198);
                auVar156 = rsqrtss(ZEXT416((uint)fVar198),auVar84);
                fVar183 = auVar156._0_4_;
                fVar231 = fVar183 * 1.5 - fVar183 * fVar183 * fVar198 * 0.5 * fVar183;
                fVar311 = fVar232 * fVar231;
                fVar258 = fVar241 * fVar231;
                fVar266 = fVar242 * fVar231;
                fVar267 = fVar243 * fVar231;
                fVar282 = fVar256 * fVar242 + fVar268 * fVar241 + fVar257 * fVar232;
                auVar84 = rcpss(auVar84,auVar84);
                fVar183 = (2.0 - fVar198 * auVar84._0_4_) * auVar84._0_4_;
                fVar185 = fVar200 * fVar258;
                fVar280 = fVar230 * fVar266;
                fVar281 = fVar166 * fVar267;
                fVar288 = fVar185 + fVar199 * fVar311 + fVar280;
                fVar289 = fVar185 + fVar185 + fVar281;
                fVar280 = fVar185 + fVar280 + fVar280;
                fVar281 = fVar185 + fVar281 + fVar281;
                fStack_3e4 = (float)local_408._4_4_;
                fStack_3e0 = fStack_400;
                fStack_3dc = fStack_3fc;
                local_538._0_4_ =
                     (SQRT(auVar296._0_4_) + 1.0) * ((float)local_408._0_4_ / SQRT(fVar198)) +
                     SQRT(auVar296._0_4_) * (float)local_408._0_4_ + local_3e8;
                fVar185 = fVar129 * fVar267;
                fVar267 = fVar267 * -fVar243;
                fVar257 = fVar266 * -fVar242 + fVar258 * -fVar241 + fVar311 * -fVar232 +
                          fVar183 * (fVar198 * fVar256 - fVar282 * fVar242) * fVar231 * fVar230 +
                          fVar183 * (fVar198 * fVar268 - fVar282 * fVar241) * fVar231 * fVar200 +
                          fVar183 * (fVar198 * fVar257 - fVar282 * fVar232) * fVar231 * fVar199;
                fVar183 = fVar126 * fVar266 + fVar124 * fVar258 + fVar82 * fVar311;
                fVar231 = auVar296._0_4_ - fVar288 * fVar288;
                auVar120._0_8_ = CONCAT44(auVar296._4_4_ - fVar289 * fVar289,fVar231);
                auVar120._8_4_ = auVar296._8_4_ - fVar280 * fVar280;
                auVar120._12_4_ = auVar296._12_4_ - fVar281 * fVar281;
                fVar268 = -fVar243 * fVar166;
                fVar166 = fVar129 * fVar166;
                fVar198 = (fVar126 * fVar230 + fVar124 * fVar200 + fVar82 * fVar199) -
                          fVar288 * fVar183;
                auVar150._8_4_ = auVar120._8_4_;
                auVar150._0_8_ = auVar120._0_8_;
                auVar150._12_4_ = auVar120._12_4_;
                auVar84 = rsqrtss(auVar150,auVar120);
                fVar256 = auVar84._0_4_;
                auVar181._0_4_ = fVar256 * 1.5 - fVar256 * fVar256 * fVar231 * 0.5 * fVar256;
                auVar181._4_12_ = auVar84._4_12_;
                local_4f8 = fVar153;
                fStack_4f4 = fVar152;
                fStack_4f0 = fVar154;
                fStack_4ec = fVar164;
                if (fVar231 < 0.0) {
                  _local_458 = auVar181;
                  local_448 = fVar198;
                  fStack_444 = fVar166;
                  fStack_440 = fVar126 * fVar230;
                  fStack_43c = fVar166;
                  local_438 = fVar183;
                  fStack_434 = fVar185;
                  fStack_430 = fVar126 * fVar266;
                  fStack_42c = fVar185;
                  local_428 = fVar288;
                  fStack_424 = fVar289;
                  fStack_420 = fVar280;
                  fStack_41c = fVar281;
                  _local_418 = auVar296;
                  fVar231 = sqrtf(fVar231);
                  pRVar68 = extraout_RAX_00;
                  auVar181 = _local_458;
                  auVar296 = _local_418;
                  fVar183 = local_438;
                  fVar185 = fStack_434;
                  fVar198 = local_448;
                  fVar166 = fStack_444;
                  fVar256 = local_428;
                }
                else {
                  fVar231 = SQRT(fVar231);
                  fVar256 = fVar288;
                }
                fVar231 = fVar231 - fVar184;
                fVar152 = ((-fVar242 * fVar230 + -fVar241 * fVar200 + -fVar232 * fVar199) -
                          fVar288 * fVar257) * auVar181._0_4_ - fVar243;
                fVar198 = fVar198 * auVar181._0_4_;
                auVar195._0_8_ = CONCAT44(fVar268,fVar152) ^ 0x8000000080000000;
                auVar226._4_4_ = fVar267;
                auVar226._0_4_ = fVar257;
                auVar182._0_4_ = fVar257 * fVar198 - fVar183 * fVar152;
                auVar195._8_4_ = -fVar268;
                auVar195._12_4_ = fVar166;
                auVar194._8_8_ = auVar195._8_8_;
                auVar194._0_8_ = CONCAT44(fVar198,fVar152) ^ 0x80000000;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar84 = divps(auVar194,auVar182);
                auVar226._8_4_ = fVar267;
                auVar226._12_4_ = -fVar185;
                auVar225._8_8_ = auVar226._8_8_;
                auVar225._0_8_ = CONCAT44(fVar183,fVar257) ^ 0x8000000000000000;
                auVar156 = divps(auVar225,auVar182);
                fVar153 = local_4f8 - (fVar231 * auVar156._0_4_ + fVar256 * auVar84._0_4_);
                fVar152 = fStack_4f4 - (fVar231 * auVar156._4_4_ + fVar256 * auVar84._4_4_);
                fVar154 = fStack_4f0 - (fVar231 * auVar156._8_4_ + fVar256 * auVar84._8_4_);
                fVar164 = fStack_4ec - (fVar231 * auVar156._12_4_ + fVar256 * auVar84._12_4_);
                if ((ABS(fVar256) < (float)local_538._0_4_) &&
                   (ABS(fVar231) < local_468 * 1.9073486e-06 + local_3e8 + (float)local_538._0_4_))
                {
                  fVar153 = local_358._0_4_ + fVar153;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar153) &&
                     (((fVar82 = (ray->super_RayK<1>).tfar, fVar153 <= fVar82 && (0.0 <= fVar152))
                      && (fVar152 <= 1.0)))) {
                    auVar84 = rsqrtss(auVar296,auVar296);
                    fVar124 = auVar84._0_4_;
                    pGVar21 = (context->scene->geometries).items[(long)pRVar71].ptr;
                    uVar80 = (ray->super_RayK<1>).mask;
                    pRVar68 = (RayHit *)(ulong)uVar80;
                    pRVar70 = pRVar71;
                    if ((pGVar21->mask & uVar80) != 0) {
                      fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * auVar296._0_4_ * -0.5 * fVar124;
                      fVar199 = fVar199 * fVar124;
                      fVar200 = fVar200 * fVar124;
                      fVar230 = fVar230 * fVar124;
                      fVar124 = fVar243 * fVar199 + fVar232;
                      fVar126 = fVar243 * fVar200 + fVar241;
                      fVar129 = fVar243 * fVar230 + fVar242;
                      fVar164 = fVar200 * fVar232 - fVar241 * fVar199;
                      fVar166 = fVar230 * fVar241 - fVar242 * fVar200;
                      fVar183 = fVar199 * fVar242 - fVar232 * fVar230;
                      fVar154 = fVar126 * fVar166 - fVar183 * fVar124;
                      fVar126 = fVar129 * fVar183 - fVar164 * fVar126;
                      fVar124 = fVar124 * fVar164 - fVar166 * fVar129;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar153;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar124,fVar126);
                        (ray->Ng).field_0.field_0.z = fVar154;
                        ray->u = fVar152;
                        ray->v = 0.0;
                        ray->primID = uVar79;
                        ray->geomID = uVar78;
                        ray->instID[0] = context->user->instID[0];
                        uVar80 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar80;
                        pRVar68 = (RayHit *)(ulong)uVar80;
                      }
                      else {
                        local_4d8 = CONCAT44(fVar124,fVar126);
                        fStack_4d0 = fVar154;
                        fStack_4cc = fVar152;
                        local_4c8 = 0;
                        local_4c4 = uVar79;
                        local_4c0 = uVar78;
                        local_4bc = context->user->instID[0];
                        pRVar70 = (RTCIntersectArguments *)(ulong)local_4bc;
                        local_4b8 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar153;
                        local_51c = 0xffffffff;
                        local_578.geometryUserPtr = pGVar21->userPtr;
                        local_578.valid = &local_51c;
                        local_578.context = context->user;
                        local_578.hit = (RTCHitN *)&local_4d8;
                        local_578.N = 1;
                        local_578.ray = (RTCRayN *)ray;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00af9b66:
                          pRVar70 = context->args;
                          if ((pRVar70->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar70->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar70->filter)(&local_578);
                            if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00af9bfd;
                          }
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_578.hit;
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_578.hit + 4);
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_578.hit + 8);
                          *(float *)((long)local_578.ray + 0x3c) = *(float *)(local_578.hit + 0xc);
                          *(float *)((long)local_578.ray + 0x40) = *(float *)(local_578.hit + 0x10);
                          *(float *)((long)local_578.ray + 0x44) = *(float *)(local_578.hit + 0x14);
                          *(float *)((long)local_578.ray + 0x48) = *(float *)(local_578.hit + 0x18);
                          *(float *)((long)local_578.ray + 0x4c) = *(float *)(local_578.hit + 0x1c);
                          pRVar70 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_578.hit + 0x20);
                          *(float *)((long)local_578.ray + 0x50) = *(float *)(local_578.hit + 0x20);
                          pRVar68 = (RayHit *)local_578.ray;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_578);
                          if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00af9b66;
LAB_00af9bfd:
                          (ray->super_RayK<1>).tfar = fVar82;
                          pRVar68 = (RayHit *)local_578.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              uVar65 = SUB84(pRVar70,0);
              fVar152 = (ray->super_RayK<1>).tfar;
              local_3d8._0_4_ = -(uint)(local_488 <= fVar152) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_484 <= fVar152) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_480 <= fVar152) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_47c <= fVar152) & local_3d8._12_4_;
              uVar69 = (undefined4)((ulong)pRVar68 >> 0x20);
              iVar64 = movmskps((int)pRVar68,local_3d8);
              fVar153 = (float)local_478._0_4_;
              fVar154 = (float)local_478._4_4_;
              fVar164 = fStack_470;
              fVar166 = fStack_46c;
            } while (iVar64 != 0);
            iVar64 = 0;
            fVar153 = (float)local_238._0_4_;
            fVar154 = (float)local_238._4_4_;
            fVar164 = fStack_230;
            fVar166 = fStack_22c;
          }
          auVar196._0_4_ =
               local_518._0_4_ & local_368._0_4_ &
               -(uint)(local_508 + (float)local_138._0_4_ <= fVar152);
          auVar196._4_4_ =
               local_518._4_4_ & local_368._4_4_ &
               -(uint)(fStack_504 + (float)local_138._4_4_ <= fVar152);
          auVar196._8_4_ =
               (uint)fStack_510 & (uint)fStack_360 & -(uint)(fStack_500 + fStack_130 <= fVar152);
          auVar196._12_4_ =
               (uint)fStack_50c & (uint)fStack_35c & -(uint)(fStack_4fc + fStack_12c <= fVar152);
          auVar121._0_4_ =
               local_498._0_4_ & auVar162._0_4_ & -(uint)(local_508 + fVar153 <= fVar152);
          auVar121._4_4_ =
               local_498._4_4_ & auVar162._4_4_ & -(uint)(fStack_504 + fVar154 <= fVar152);
          auVar121._8_4_ =
               local_498._8_4_ & auVar162._8_4_ & -(uint)(fStack_500 + fVar164 <= fVar152);
          auVar121._12_4_ =
               local_498._12_4_ & auVar162._12_4_ & -(uint)(fStack_4fc + fVar166 <= fVar152);
          iVar64 = movmskps(iVar64,auVar121 | auVar196);
          auVar104 = local_538;
          if (iVar64 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar73 * 0x30) = auVar121 | auVar196;
            auStack_e8[uVar73 * 0xc] =
                 ~auVar196._0_4_ & (uint)fVar153 | local_138._0_4_ & auVar196._0_4_;
            auStack_e8[uVar73 * 0xc + 1] =
                 ~auVar196._4_4_ & (uint)fVar154 | local_138._4_4_ & auVar196._4_4_;
            auStack_e8[uVar73 * 0xc + 2] =
                 ~auVar196._8_4_ & (uint)fVar164 | (uint)fStack_130 & auVar196._8_4_;
            auStack_e8[uVar73 * 0xc + 3] =
                 ~auVar196._12_4_ & (uint)fVar166 | (uint)fStack_12c & auVar196._12_4_;
            (&uStack_d8)[uVar73 * 6] = CONCAT44(fStack_194,local_198);
            aiStack_d0[uVar73 * 0xc] = (int)fVar165 + 1;
            iVar72 = iVar72 + 1;
          }
        }
      }
    }
    local_538 = auVar104;
    fVar165 = (ray->super_RayK<1>).tfar;
    if (iVar72 == 0) break;
    uVar83 = -iVar72;
    pauVar67 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar72 - 1) * 0x30);
    uVar80 = uVar83;
    while( true ) {
      local_578.valid._0_4_ =
           -(uint)(local_508 + *(float *)pauVar67[1] <= fVar165) & *(uint *)*pauVar67;
      local_578.valid._4_4_ =
           -(uint)(fStack_504 + *(float *)(pauVar67[1] + 4) <= fVar165) & *(uint *)(*pauVar67 + 4);
      local_578.geometryUserPtr._0_4_ =
           -(uint)(fStack_500 + *(float *)(pauVar67[1] + 8) <= fVar165) & *(uint *)(*pauVar67 + 8);
      local_578.geometryUserPtr._4_4_ =
           -(uint)(fStack_4fc + *(float *)(pauVar67[1] + 0xc) <= fVar165) &
           *(uint *)(*pauVar67 + 0xc);
      iVar64 = movmskps(uVar80,(undefined1  [16])local_578._0_16_);
      if (iVar64 != 0) break;
      pauVar67 = pauVar67 + -3;
      uVar83 = uVar83 + 1;
      uVar80 = 0;
      if (uVar83 == 0) {
        uVar65 = 0;
        goto LAB_00af9da8;
      }
    }
    auVar160._0_4_ = (uint)*(float *)pauVar67[1] & (uint)local_578.valid;
    auVar160._4_4_ = (uint)*(float *)(pauVar67[1] + 4) & local_578.valid._4_4_;
    auVar160._8_4_ = (uint)*(float *)(pauVar67[1] + 8) & (uint)local_578.geometryUserPtr;
    auVar160._12_4_ = (uint)*(float *)(pauVar67[1] + 0xc) & local_578.geometryUserPtr._4_4_;
    auVar176._0_8_ = CONCAT44(~local_578.valid._4_4_,~(uint)local_578.valid) & 0x7f8000007f800000;
    auVar176._8_4_ = ~(uint)local_578.geometryUserPtr & 0x7f800000;
    auVar176._12_4_ = ~local_578.geometryUserPtr._4_4_ & 0x7f800000;
    auVar176 = auVar176 | auVar160;
    auVar161._4_4_ = auVar176._0_4_;
    auVar161._0_4_ = auVar176._4_4_;
    auVar161._8_4_ = auVar176._12_4_;
    auVar161._12_4_ = auVar176._8_4_;
    auVar84 = minps(auVar161,auVar176);
    auVar110._0_8_ = auVar84._8_8_;
    auVar110._8_4_ = auVar84._0_4_;
    auVar110._12_4_ = auVar84._4_4_;
    auVar84 = minps(auVar110,auVar84);
    auVar111._0_8_ =
         CONCAT44(-(uint)(auVar84._4_4_ == auVar176._4_4_) & local_578.valid._4_4_,
                  -(uint)(auVar84._0_4_ == auVar176._0_4_) & (uint)local_578.valid);
    auVar111._8_4_ = -(uint)(auVar84._8_4_ == auVar176._8_4_) & (uint)local_578.geometryUserPtr;
    auVar111._12_4_ = -(uint)(auVar84._12_4_ == auVar176._12_4_) & local_578.geometryUserPtr._4_4_;
    iVar64 = movmskps(iVar64,auVar111);
    auVar146 = (undefined1  [16])local_578._0_16_;
    if (iVar64 != 0) {
      auVar146._8_4_ = auVar111._8_4_;
      auVar146._0_8_ = auVar111._0_8_;
      auVar146._12_4_ = auVar111._12_4_;
    }
    uVar19 = *(undefined8 *)pauVar67[2];
    fVar165 = *(float *)(pauVar67[2] + 8);
    uVar80 = movmskps(iVar64,auVar146);
    pRVar70 = (RTCIntersectArguments *)0x0;
    if (uVar80 != 0) {
      for (; (uVar80 >> (long)pRVar70 & 1) == 0;
          pRVar70 = (RTCIntersectArguments *)((long)&pRVar70->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&local_578.valid + (long)pRVar70 * 4) = 0;
    *pauVar67 = (undefined1  [16])local_578._0_16_;
    iVar64 = movmskps((int)pauVar67,(undefined1  [16])local_578._0_16_);
    lVar76 = CONCAT44((int)((ulong)pauVar67 >> 0x20),iVar64);
    uVar80 = ~uVar83;
    if (iVar64 != 0) {
      uVar80 = -uVar83;
    }
    uVar73 = (ulong)uVar80;
    fVar82 = (float)uVar19;
    fVar124 = (float)((ulong)uVar19 >> 0x20) - fVar82;
    local_4d8 = CONCAT44(fVar124 * 0.33333334 + fVar82,fVar124 * 0.0 + fVar82);
    fStack_4d0 = fVar124 * 0.6666667 + fVar82;
    fStack_4cc = fVar124 * 1.0 + fVar82;
    local_198 = *(float *)((long)&local_4d8 + (long)pRVar70 * 4);
    fStack_194 = *(float *)((long)&local_4d8 + (long)pRVar70 * 4 + 4);
  } while( true );
LAB_00af9da8:
  auVar151._4_4_ = -(uint)(fStack_214 <= fVar165);
  auVar151._0_4_ = -(uint)(local_218 <= fVar165);
  auVar151._8_4_ = -(uint)(fStack_210 <= fVar165);
  auVar151._12_4_ = -(uint)(fStack_20c <= fVar165);
  uVar78 = movmskps(uVar65,auVar151);
  uVar77 = uVar77 - 1 & uVar77 & uVar78;
  if (uVar77 == 0) {
    return;
  }
  goto LAB_00af7582;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }